

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  ulong uVar59;
  uint uVar60;
  long lVar61;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar82 [16];
  ulong uVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  int iVar67;
  long lVar68;
  bool bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar146;
  uint uVar147;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar148;
  uint uVar152;
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar145 [64];
  float pp;
  undefined4 uVar154;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar153;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar155;
  undefined1 auVar164 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar231;
  float fVar234;
  float fVar235;
  undefined1 auVar232 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [64];
  float fVar240;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar244;
  float fVar245;
  undefined1 auVar243 [32];
  undefined1 auVar246 [64];
  float t;
  float fVar247;
  float fVar252;
  undefined1 auVar248 [16];
  float fVar250;
  float fVar251;
  float fVar253;
  undefined1 auVar249 [64];
  float s;
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  bool local_cb9;
  float local_be0;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  Primitive *local_850;
  ulong local_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  int aiStack_158 [74];
  undefined1 auVar140 [64];
  undefined1 auVar144 [64];
  
  PVar2 = prim[1];
  uVar70 = (ulong)(byte)PVar2;
  lVar68 = uVar70 * 0x25;
  fVar231 = *(float *)(prim + lVar68 + 0x12);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar77 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar78 = vsubps_avx(auVar72,*(undefined1 (*) [16])(prim + lVar68 + 6));
  fVar210 = fVar231 * auVar78._0_4_;
  fVar153 = fVar231 * auVar77._0_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar72);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar87 = vpmovsxbd_avx2(auVar15);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar74);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 0xf + 6);
  auVar89 = vpmovsxbd_avx2(auVar75);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar95 = vpmovsxbd_avx2(auVar82);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar95);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar70 + 6);
  auVar91 = vpmovsxbd_avx2(auVar161);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar70 * 0x1a + 6);
  auVar92 = vpmovsxbd_avx2(auVar73);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 0x1b + 6);
  auVar93 = vpmovsxbd_avx2(auVar76);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar70 * 0x1c + 6);
  auVar85 = vpmovsxbd_avx2(auVar248);
  auVar94 = vcvtdq2ps_avx(auVar85);
  auVar102._4_4_ = fVar153;
  auVar102._0_4_ = fVar153;
  auVar102._8_4_ = fVar153;
  auVar102._12_4_ = fVar153;
  auVar102._16_4_ = fVar153;
  auVar102._20_4_ = fVar153;
  auVar102._24_4_ = fVar153;
  auVar102._28_4_ = fVar153;
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  auVar83 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = ZEXT1632(CONCAT412(fVar231 * auVar77._12_4_,
                               CONCAT48(fVar231 * auVar77._8_4_,
                                        CONCAT44(fVar231 * auVar77._4_4_,fVar153))));
  auVar96 = vpermps_avx2(auVar109,auVar97);
  auVar84 = vpermps_avx512vl(auVar83,auVar97);
  fVar234 = auVar84._0_4_;
  fVar235 = auVar84._4_4_;
  auVar97._4_4_ = fVar235 * auVar88._4_4_;
  auVar97._0_4_ = fVar234 * auVar88._0_4_;
  fVar236 = auVar84._8_4_;
  auVar97._8_4_ = fVar236 * auVar88._8_4_;
  fVar237 = auVar84._12_4_;
  auVar97._12_4_ = fVar237 * auVar88._12_4_;
  fVar238 = auVar84._16_4_;
  auVar97._16_4_ = fVar238 * auVar88._16_4_;
  fVar253 = auVar84._20_4_;
  auVar97._20_4_ = fVar253 * auVar88._20_4_;
  fVar239 = auVar84._24_4_;
  auVar97._24_4_ = fVar239 * auVar88._24_4_;
  auVar97._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar91._4_4_ * fVar235;
  auVar95._0_4_ = auVar91._0_4_ * fVar234;
  auVar95._8_4_ = auVar91._8_4_ * fVar236;
  auVar95._12_4_ = auVar91._12_4_ * fVar237;
  auVar95._16_4_ = auVar91._16_4_ * fVar238;
  auVar95._20_4_ = auVar91._20_4_ * fVar253;
  auVar95._24_4_ = auVar91._24_4_ * fVar239;
  auVar95._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar94._4_4_ * fVar235;
  auVar85._0_4_ = auVar94._0_4_ * fVar234;
  auVar85._8_4_ = auVar94._8_4_ * fVar236;
  auVar85._12_4_ = auVar94._12_4_ * fVar237;
  auVar85._16_4_ = auVar94._16_4_ * fVar238;
  auVar85._20_4_ = auVar94._20_4_ * fVar253;
  auVar85._24_4_ = auVar94._24_4_ * fVar239;
  auVar85._28_4_ = auVar84._28_4_;
  auVar72 = vfmadd231ps_fma(auVar97,auVar96,auVar87);
  auVar15 = vfmadd231ps_fma(auVar95,auVar96,auVar90);
  auVar74 = vfmadd231ps_fma(auVar85,auVar93,auVar96);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar102,auVar86);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar102,auVar89);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar92,auVar102);
  auVar108._4_4_ = fVar210;
  auVar108._0_4_ = fVar210;
  auVar108._8_4_ = fVar210;
  auVar108._12_4_ = fVar210;
  auVar108._16_4_ = fVar210;
  auVar108._20_4_ = fVar210;
  auVar108._24_4_ = fVar210;
  auVar108._28_4_ = fVar210;
  auVar85 = ZEXT1632(CONCAT412(fVar231 * auVar78._12_4_,
                               CONCAT48(fVar231 * auVar78._8_4_,
                                        CONCAT44(fVar231 * auVar78._4_4_,fVar210))));
  auVar95 = vpermps_avx2(auVar109,auVar85);
  auVar85 = vpermps_avx512vl(auVar83,auVar85);
  fVar231 = auVar85._0_4_;
  fVar234 = auVar85._4_4_;
  auVar96._4_4_ = fVar234 * auVar88._4_4_;
  auVar96._0_4_ = fVar231 * auVar88._0_4_;
  fVar235 = auVar85._8_4_;
  auVar96._8_4_ = fVar235 * auVar88._8_4_;
  fVar236 = auVar85._12_4_;
  auVar96._12_4_ = fVar236 * auVar88._12_4_;
  fVar237 = auVar85._16_4_;
  auVar96._16_4_ = fVar237 * auVar88._16_4_;
  fVar238 = auVar85._20_4_;
  auVar96._20_4_ = fVar238 * auVar88._20_4_;
  fVar253 = auVar85._24_4_;
  auVar96._24_4_ = fVar253 * auVar88._24_4_;
  auVar96._28_4_ = fVar153;
  auVar83._4_4_ = auVar91._4_4_ * fVar234;
  auVar83._0_4_ = auVar91._0_4_ * fVar231;
  auVar83._8_4_ = auVar91._8_4_ * fVar235;
  auVar83._12_4_ = auVar91._12_4_ * fVar236;
  auVar83._16_4_ = auVar91._16_4_ * fVar237;
  auVar83._20_4_ = auVar91._20_4_ * fVar238;
  auVar83._24_4_ = auVar91._24_4_ * fVar253;
  auVar83._28_4_ = auVar88._28_4_;
  auVar91._4_4_ = auVar94._4_4_ * fVar234;
  auVar91._0_4_ = auVar94._0_4_ * fVar231;
  auVar91._8_4_ = auVar94._8_4_ * fVar235;
  auVar91._12_4_ = auVar94._12_4_ * fVar236;
  auVar91._16_4_ = auVar94._16_4_ * fVar237;
  auVar91._20_4_ = auVar94._20_4_ * fVar238;
  auVar91._24_4_ = auVar94._24_4_ * fVar253;
  auVar91._28_4_ = auVar85._28_4_;
  auVar75 = vfmadd231ps_fma(auVar96,auVar95,auVar87);
  auVar82 = vfmadd231ps_fma(auVar83,auVar95,auVar90);
  auVar161 = vfmadd231ps_fma(auVar91,auVar95,auVar93);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar108,auVar86);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar108,auVar89);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar260 = ZEXT3264(auVar86);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar108,auVar92);
  vandps_avx512vl(ZEXT1632(auVar72),auVar86);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar86,auVar106,1);
  bVar69 = (bool)((byte)uVar59 & 1);
  auVar84._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._0_4_;
  bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._4_4_;
  bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._8_4_;
  bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar15),auVar86);
  uVar59 = vcmpps_avx512vl(auVar84,auVar106,1);
  bVar69 = (bool)((byte)uVar59 & 1);
  auVar98._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._0_4_;
  bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._4_4_;
  bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._8_4_;
  bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar74),auVar86);
  uVar59 = vcmpps_avx512vl(auVar98,auVar106,1);
  bVar69 = (bool)((byte)uVar59 & 1);
  auVar86._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._0_4_;
  bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._4_4_;
  bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._8_4_;
  bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar74._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar87 = vrcp14ps_avx512vl(auVar84);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = &DAT_3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar84,auVar87,auVar107);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar98);
  auVar15 = vfnmadd213ps_fma(auVar98,auVar87,auVar107);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar86);
  auVar74 = vfnmadd213ps_fma(auVar86,auVar87,auVar107);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar87,auVar87);
  fVar231 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar68 + 0x16)) *
            *(float *)(prim + lVar68 + 0x1a);
  auVar104._4_4_ = fVar231;
  auVar104._0_4_ = fVar231;
  auVar104._8_4_ = fVar231;
  auVar104._12_4_ = fVar231;
  auVar104._16_4_ = fVar231;
  auVar104._20_4_ = fVar231;
  auVar104._24_4_ = fVar231;
  auVar104._28_4_ = fVar231;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xb + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar75 = vfmadd213ps_fma(auVar87,auVar104,auVar86);
  auVar86 = vcvtdq2ps_avx(auVar88);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xd + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar82 = vfmadd213ps_fma(auVar87,auVar104,auVar86);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x12 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar59 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 2 + uVar59 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar161 = vfmadd213ps_fma(auVar87,auVar104,auVar86);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x18 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar73 = vfmadd213ps_fma(auVar87,auVar104,auVar86);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x1d + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 + (ulong)(byte)PVar2 * 0x20 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar76 = vfmadd213ps_fma(auVar87,auVar104,auVar86);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar2 * 0x20 - uVar70) + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x23 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar248 = vfmadd213ps_fma(auVar87,auVar104,auVar86);
  auVar86 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar77));
  auVar92._4_4_ = auVar72._4_4_ * auVar86._4_4_;
  auVar92._0_4_ = auVar72._0_4_ * auVar86._0_4_;
  auVar92._8_4_ = auVar72._8_4_ * auVar86._8_4_;
  auVar92._12_4_ = auVar72._12_4_ * auVar86._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar77));
  auVar101._0_4_ = auVar72._0_4_ * auVar86._0_4_;
  auVar101._4_4_ = auVar72._4_4_ * auVar86._4_4_;
  auVar101._8_4_ = auVar72._8_4_ * auVar86._8_4_;
  auVar101._12_4_ = auVar72._12_4_ * auVar86._12_4_;
  auVar101._16_4_ = auVar86._16_4_ * 0.0;
  auVar101._20_4_ = auVar86._20_4_ * 0.0;
  auVar101._24_4_ = auVar86._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar86 = vsubps_avx(ZEXT1632(auVar161),ZEXT1632(auVar78));
  auVar93._4_4_ = auVar15._4_4_ * auVar86._4_4_;
  auVar93._0_4_ = auVar15._0_4_ * auVar86._0_4_;
  auVar93._8_4_ = auVar15._8_4_ * auVar86._8_4_;
  auVar93._12_4_ = auVar15._12_4_ * auVar86._12_4_;
  auVar93._16_4_ = auVar86._16_4_ * 0.0;
  auVar93._20_4_ = auVar86._20_4_ * 0.0;
  auVar93._24_4_ = auVar86._24_4_ * 0.0;
  auVar93._28_4_ = auVar86._28_4_;
  auVar86 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar78));
  auVar100._0_4_ = auVar15._0_4_ * auVar86._0_4_;
  auVar100._4_4_ = auVar15._4_4_ * auVar86._4_4_;
  auVar100._8_4_ = auVar15._8_4_ * auVar86._8_4_;
  auVar100._12_4_ = auVar15._12_4_ * auVar86._12_4_;
  auVar100._16_4_ = auVar86._16_4_ * 0.0;
  auVar100._20_4_ = auVar86._20_4_ * 0.0;
  auVar100._24_4_ = auVar86._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar86 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar79));
  auVar94._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar94._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar94._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar94._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar94._16_4_ = auVar86._16_4_ * 0.0;
  auVar94._20_4_ = auVar86._20_4_ * 0.0;
  auVar94._24_4_ = auVar86._24_4_ * 0.0;
  auVar94._28_4_ = auVar86._28_4_;
  auVar86 = vsubps_avx(ZEXT1632(auVar248),ZEXT1632(auVar79));
  auVar99._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar99._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar99._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar99._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar99._16_4_ = auVar86._16_4_ * 0.0;
  auVar99._20_4_ = auVar86._20_4_ * 0.0;
  auVar99._24_4_ = auVar86._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar92,auVar101);
  auVar87 = vpminsd_avx2(auVar93,auVar100);
  auVar86 = vmaxps_avx(auVar86,auVar87);
  auVar87 = vpminsd_avx2(auVar94,auVar99);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar88._4_4_ = uVar154;
  auVar88._0_4_ = uVar154;
  auVar88._8_4_ = uVar154;
  auVar88._12_4_ = uVar154;
  auVar88._16_4_ = uVar154;
  auVar88._20_4_ = uVar154;
  auVar88._24_4_ = uVar154;
  auVar88._28_4_ = uVar154;
  auVar87 = vmaxps_avx512vl(auVar87,auVar88);
  auVar86 = vmaxps_avx(auVar86,auVar87);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  auVar87._16_4_ = 0x3f7ffffa;
  auVar87._20_4_ = 0x3f7ffffa;
  auVar87._24_4_ = 0x3f7ffffa;
  auVar87._28_4_ = 0x3f7ffffa;
  local_620 = vmulps_avx512vl(auVar86,auVar87);
  auVar86 = vpmaxsd_avx2(auVar92,auVar101);
  auVar87 = vpmaxsd_avx2(auVar93,auVar100);
  auVar86 = vminps_avx(auVar86,auVar87);
  auVar87 = vpmaxsd_avx2(auVar94,auVar99);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar89._4_4_ = uVar154;
  auVar89._0_4_ = uVar154;
  auVar89._8_4_ = uVar154;
  auVar89._12_4_ = uVar154;
  auVar89._16_4_ = uVar154;
  auVar89._20_4_ = uVar154;
  auVar89._24_4_ = uVar154;
  auVar89._28_4_ = uVar154;
  auVar87 = vminps_avx512vl(auVar87,auVar89);
  auVar86 = vminps_avx(auVar86,auVar87);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar90);
  auVar87 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar87,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_620,auVar86,2);
  bVar69 = (byte)((byte)uVar16 & (byte)uVar18) == 0;
  local_cb9 = !bVar69;
  if (bVar69) {
    return local_cb9;
  }
  local_848 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  auVar175 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar175);
  local_850 = prim;
LAB_01f181af:
  lVar68 = 0;
  for (uVar59 = local_848; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  uVar60 = *(uint *)(local_850 + 2);
  pGVar3 = (context->scene->geometries).items[uVar60].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_850 + lVar68 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar231 = (pGVar3->time_range).lower;
  fVar231 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar231) / ((pGVar3->time_range).upper - fVar231));
  auVar72 = vroundss_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),9);
  auVar72 = vminss_avx(auVar72,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar72 = vmaxss_avx(ZEXT816(0) << 0x20,auVar72);
  fVar231 = fVar231 - auVar72._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar72._0_4_ * 0x38;
  lVar68 = *(long *)(_Var4 + 0x10 + lVar61);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar61);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar5 + uVar59 * lVar6);
  auVar78._0_4_ = fVar231 * *pfVar1;
  auVar78._4_4_ = fVar231 * pfVar1[1];
  auVar78._8_4_ = fVar231 * pfVar1[2];
  auVar78._12_4_ = fVar231 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar59 + 1) * lVar6);
  auVar79._0_4_ = fVar231 * *pfVar1;
  auVar79._4_4_ = fVar231 * pfVar1[1];
  auVar79._8_4_ = fVar231 * pfVar1[2];
  auVar79._12_4_ = fVar231 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar59 + 2) * lVar6);
  auVar80._0_4_ = fVar231 * *pfVar1;
  auVar80._4_4_ = fVar231 * pfVar1[1];
  auVar80._8_4_ = fVar231 * pfVar1[2];
  auVar80._12_4_ = fVar231 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar59 + 3));
  auVar221._0_4_ = fVar231 * *pfVar1;
  auVar221._4_4_ = fVar231 * pfVar1[1];
  auVar221._8_4_ = fVar231 * pfVar1[2];
  auVar221._12_4_ = fVar231 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar61);
  fVar231 = 1.0 - fVar231;
  auVar81._4_4_ = fVar231;
  auVar81._0_4_ = fVar231;
  auVar81._8_4_ = fVar231;
  auVar81._12_4_ = fVar231;
  auVar74 = vfmadd231ps_fma(auVar78,auVar81,*(undefined1 (*) [16])(lVar5 + lVar68 * uVar59));
  auVar75 = vfmadd231ps_fma(auVar79,auVar81,*(undefined1 (*) [16])(lVar5 + lVar68 * (uVar59 + 1)));
  auVar82 = vfmadd231ps_fma(auVar80,auVar81,*(undefined1 (*) [16])(lVar5 + lVar68 * (uVar59 + 2)));
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar175 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar175);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar72 = vunpcklps_avx512vl(auVar86._0_16_,auVar87._0_16_);
  fVar231 = *(float *)(ray + k * 4 + 0x180);
  auVar258._4_4_ = fVar231;
  auVar258._0_4_ = fVar231;
  auVar258._8_4_ = fVar231;
  auVar258._12_4_ = fVar231;
  local_6a0._16_4_ = fVar231;
  local_6a0._0_16_ = auVar258;
  local_6a0._20_4_ = fVar231;
  local_6a0._24_4_ = fVar231;
  local_6a0._28_4_ = fVar231;
  local_970 = vinsertps_avx(auVar72,auVar258,0x28);
  fVar153 = *(float *)(ray + k * 4 + 0xc0);
  auVar255 = ZEXT464((uint)fVar153);
  auVar232._0_4_ = auVar74._0_4_ + auVar75._0_4_;
  auVar232._4_4_ = auVar74._4_4_ + auVar75._4_4_;
  auVar232._8_4_ = auVar74._8_4_ + auVar75._8_4_;
  auVar232._12_4_ = auVar74._12_4_ + auVar75._12_4_;
  auVar77._8_4_ = 0x3f000000;
  auVar77._0_8_ = 0x3f0000003f000000;
  auVar77._12_4_ = 0x3f000000;
  auVar72 = vmulps_avx512vl(auVar232,auVar77);
  auVar72 = vsubps_avx(auVar72,auVar15);
  auVar72 = vdpps_avx(auVar72,local_970,0x7f);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  auVar76 = ZEXT816(0) << 0x40;
  auVar249 = ZEXT1664(auVar76);
  auVar241._4_12_ = ZEXT812(0) << 0x20;
  auVar241._0_4_ = local_980._0_4_;
  auVar73 = vrcp14ss_avx512f(auVar76,auVar241);
  auVar161 = vfnmadd213ss_fma(auVar73,local_980,ZEXT416(0x40000000));
  local_5c0 = auVar72._0_4_ * auVar161._0_4_ * auVar73._0_4_;
  auVar233 = ZEXT464((uint)local_5c0);
  auVar242._4_4_ = local_5c0;
  auVar242._0_4_ = local_5c0;
  auVar242._8_4_ = local_5c0;
  auVar242._12_4_ = local_5c0;
  fStack_7d0 = local_5c0;
  _local_7e0 = auVar242;
  fStack_7cc = local_5c0;
  fStack_7c8 = local_5c0;
  fStack_7c4 = local_5c0;
  auVar72 = vfmadd231ps_fma(auVar15,local_970,auVar242);
  auVar72 = vblendps_avx(auVar72,auVar76,8);
  auVar15 = vsubps_avx(auVar74,auVar72);
  auVar74 = vsubps_avx(auVar82,auVar72);
  auVar246 = ZEXT1664(auVar74);
  auVar82 = vfmadd231ps_fma(auVar221,auVar81,*(undefined1 (*) [16])(lVar5 + lVar68 * (uVar59 + 3)));
  auVar75 = vsubps_avx(auVar75,auVar72);
  auVar72 = vsubps_avx(auVar82,auVar72);
  auVar88 = vbroadcastss_avx512vl(auVar15);
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_900 = ZEXT1632(auVar15);
  auVar89 = vpermps_avx512vl(auVar110,local_900);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  auVar138._0_32_ = vpermps_avx512vl(auVar111,local_900);
  auVar112._8_4_ = 3;
  auVar112._0_8_ = 0x300000003;
  auVar112._12_4_ = 3;
  auVar112._16_4_ = 3;
  auVar112._20_4_ = 3;
  auVar112._24_4_ = 3;
  auVar112._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar112,local_900);
  auVar91 = vbroadcastss_avx512vl(auVar75);
  local_940 = ZEXT1632(auVar75);
  auVar92 = vpermps_avx512vl(auVar110,local_940);
  auVar93 = vpermps_avx512vl(auVar111,local_940);
  auVar94 = vpermps_avx512vl(auVar112,local_940);
  auVar95 = vbroadcastss_avx512vl(auVar74);
  local_920 = ZEXT1632(auVar74);
  auVar175._0_32_ = vpermps_avx512vl(auVar110,local_920);
  local_520 = vpermps_avx2(auVar111,local_920);
  local_540 = vpermps_avx2(auVar112,local_920);
  local_5e0 = vbroadcastss_avx512vl(auVar72);
  _local_960 = ZEXT1632(auVar72);
  local_600 = vpermps_avx512vl(auVar110,_local_960);
  local_560 = vpermps_avx2(auVar111,_local_960);
  _local_580 = vpermps_avx2(auVar112,_local_960);
  auVar85 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar231 * fVar231)),auVar87,auVar87);
  local_6c0 = vfmadd231ps_avx512vl(auVar85,auVar86,auVar86);
  uVar154 = local_6c0._0_4_;
  local_5a0._4_4_ = uVar154;
  local_5a0._0_4_ = uVar154;
  local_5a0._8_4_ = uVar154;
  local_5a0._12_4_ = uVar154;
  local_5a0._16_4_ = uVar154;
  local_5a0._20_4_ = uVar154;
  local_5a0._24_4_ = uVar154;
  local_5a0._28_4_ = uVar154;
  vandps_avx512vl(local_5a0,auVar260._0_32_);
  local_8b0 = ZEXT416((uint)local_5c0);
  local_5c0 = fVar153 - local_5c0;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  bVar65 = 0;
  iVar67 = 1;
  auVar260 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar260);
  auVar72 = vsqrtss_avx(local_980,local_980);
  auVar15 = vsqrtss_avx(local_980,local_980);
  local_8d0 = ZEXT816(0x3f80000000000000);
  auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar85 = auVar260._32_32_;
  uVar59 = 0;
  do {
    auVar74 = vmovshdup_avx(local_8d0);
    fVar234 = local_8d0._0_4_;
    fVar231 = auVar74._0_4_ - fVar234;
    fVar239 = fVar231 * 0.04761905;
    auVar226._4_4_ = fVar234;
    auVar226._0_4_ = fVar234;
    auVar226._8_4_ = fVar234;
    auVar226._12_4_ = fVar234;
    auVar226._16_4_ = fVar234;
    auVar226._20_4_ = fVar234;
    auVar226._24_4_ = fVar234;
    auVar226._28_4_ = fVar234;
    auVar165._4_4_ = fVar231;
    auVar165._0_4_ = fVar231;
    auVar165._8_4_ = fVar231;
    auVar165._12_4_ = fVar231;
    auVar165._16_4_ = fVar231;
    auVar165._20_4_ = fVar231;
    auVar165._24_4_ = fVar231;
    auVar165._28_4_ = fVar231;
    auVar74 = vfmadd231ps_fma(auVar226,auVar165,_DAT_02020f20);
    auVar96 = vsubps_avx(auVar220._0_32_,ZEXT1632(auVar74));
    fVar231 = auVar74._0_4_;
    fVar234 = auVar74._4_4_;
    fVar235 = auVar74._8_4_;
    fVar236 = auVar74._12_4_;
    fVar237 = auVar96._0_4_;
    fVar238 = auVar96._4_4_;
    fVar253 = auVar96._8_4_;
    fVar210 = auVar96._12_4_;
    fVar240 = auVar96._16_4_;
    fVar155 = auVar96._20_4_;
    fVar244 = auVar96._24_4_;
    auVar119._4_4_ = fVar238 * fVar238 * -fVar234;
    auVar119._0_4_ = fVar237 * fVar237 * -fVar231;
    auVar119._8_4_ = fVar253 * fVar253 * -fVar235;
    auVar119._12_4_ = fVar210 * fVar210 * -fVar236;
    auVar119._16_4_ = fVar240 * fVar240 * -0.0;
    auVar119._20_4_ = fVar155 * fVar155 * -0.0;
    auVar119._24_4_ = fVar244 * fVar244 * -0.0;
    auVar119._28_4_ = 0x80000000;
    auVar260._28_36_ = auVar233._28_36_;
    auVar260._0_28_ =
         ZEXT1628(CONCAT412(fVar236 * fVar236,
                            CONCAT48(fVar235 * fVar235,CONCAT44(fVar234 * fVar234,fVar231 * fVar231)
                                    )));
    fVar247 = fVar231 * 3.0;
    fVar250 = fVar234 * 3.0;
    fVar251 = fVar235 * 3.0;
    fVar252 = fVar236 * 3.0;
    auVar220._28_36_ = auVar249._28_36_;
    auVar220._0_28_ = ZEXT1628(CONCAT412(fVar252,CONCAT48(fVar251,CONCAT44(fVar250,fVar247))));
    auVar190._0_4_ = (fVar247 + -5.0) * fVar231 * fVar231 + 2.0;
    auVar190._4_4_ = (fVar250 + -5.0) * fVar234 * fVar234 + 2.0;
    auVar190._8_4_ = (fVar251 + -5.0) * fVar235 * fVar235 + 2.0;
    auVar190._12_4_ = (fVar252 + -5.0) * fVar236 * fVar236 + 2.0;
    auVar190._16_4_ = 0x40000000;
    auVar190._20_4_ = 0x40000000;
    auVar190._24_4_ = 0x40000000;
    auVar190._28_4_ = 0x40000000;
    auVar233._0_4_ = fVar237 * fVar237;
    auVar233._4_4_ = fVar238 * fVar238;
    auVar233._8_4_ = fVar253 * fVar253;
    auVar233._12_4_ = fVar210 * fVar210;
    auVar233._16_4_ = fVar240 * fVar240;
    auVar233._20_4_ = fVar155 * fVar155;
    auVar233._28_36_ = auVar255._28_36_;
    auVar233._24_4_ = fVar244 * fVar244;
    auVar208._0_4_ = auVar233._0_4_ * (fVar237 * 3.0 + -5.0) + 2.0;
    auVar208._4_4_ = auVar233._4_4_ * (fVar238 * 3.0 + -5.0) + 2.0;
    auVar208._8_4_ = auVar233._8_4_ * (fVar253 * 3.0 + -5.0) + 2.0;
    auVar208._12_4_ = auVar233._12_4_ * (fVar210 * 3.0 + -5.0) + 2.0;
    auVar208._16_4_ = auVar233._16_4_ * (fVar240 * 3.0 + -5.0) + 2.0;
    auVar208._20_4_ = auVar233._20_4_ * (fVar155 * 3.0 + -5.0) + 2.0;
    auVar208._24_4_ = auVar233._24_4_ * (fVar244 * 3.0 + -5.0) + 2.0;
    auVar208._28_4_ = auVar246._28_4_ + -5.0 + 2.0;
    fVar245 = auVar96._28_4_;
    auVar120._4_4_ = fVar234 * fVar234 * -fVar238;
    auVar120._0_4_ = fVar231 * fVar231 * -fVar237;
    auVar120._8_4_ = fVar235 * fVar235 * -fVar253;
    auVar120._12_4_ = fVar236 * fVar236 * -fVar210;
    auVar120._16_4_ = -fVar240 * 0.0 * 0.0;
    auVar120._20_4_ = -fVar155 * 0.0 * 0.0;
    auVar120._24_4_ = -fVar244 * 0.0 * 0.0;
    auVar120._28_4_ = -fVar245;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar96 = vmulps_avx512vl(auVar119,auVar84);
    auVar97 = vmulps_avx512vl(auVar190,auVar84);
    auVar83 = vmulps_avx512vl(auVar208,auVar84);
    auVar98 = vmulps_avx512vl(auVar120,auVar84);
    auVar99 = vmulps_avx512vl(local_5e0,auVar98);
    auVar100 = vmulps_avx512vl(local_600,auVar98);
    auVar101 = vmulps_avx512vl(local_560,auVar98);
    auVar121._4_4_ = (float)local_580._4_4_ * auVar98._4_4_;
    auVar121._0_4_ = (float)local_580._0_4_ * auVar98._0_4_;
    auVar121._8_4_ = fStack_578 * auVar98._8_4_;
    auVar121._12_4_ = fStack_574 * auVar98._12_4_;
    auVar121._16_4_ = fStack_570 * auVar98._16_4_;
    auVar121._20_4_ = fStack_56c * auVar98._20_4_;
    auVar121._24_4_ = fStack_568 * auVar98._24_4_;
    auVar121._28_4_ = auVar98._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar83,auVar95);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar83,auVar175._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar83,local_520);
    auVar74 = vfmadd231ps_fma(auVar121,local_540,auVar83);
    auVar83 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar92);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar93);
    auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,auVar97);
    auVar101 = vfmadd231ps_avx512vl(auVar83,auVar96,auVar88);
    local_800 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar89);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar138._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar96);
    auVar124._4_4_ = (fVar238 + fVar238) * fVar234;
    auVar124._0_4_ = (fVar237 + fVar237) * fVar231;
    auVar124._8_4_ = (fVar253 + fVar253) * fVar235;
    auVar124._12_4_ = (fVar210 + fVar210) * fVar236;
    auVar124._16_4_ = (fVar240 + fVar240) * 0.0;
    auVar124._20_4_ = (fVar155 + fVar155) * 0.0;
    auVar124._24_4_ = (fVar244 + fVar244) * 0.0;
    auVar124._28_4_ = auVar97._28_4_;
    auVar96 = vsubps_avx(auVar124,auVar233._0_32_);
    auVar227._0_28_ =
         ZEXT1628(CONCAT412((fVar236 + fVar236) * (fVar252 + -5.0) + fVar252 * fVar236,
                            CONCAT48((fVar235 + fVar235) * (fVar251 + -5.0) + fVar251 * fVar235,
                                     CONCAT44((fVar234 + fVar234) * (fVar250 + -5.0) +
                                              fVar250 * fVar234,
                                              (fVar231 + fVar231) * (fVar247 + -5.0) +
                                              fVar247 * fVar231))));
    auVar227._28_4_ = auVar249._28_4_ + -5.0 + 0.0;
    auVar113._8_4_ = 0x40000000;
    auVar113._0_8_ = 0x4000000040000000;
    auVar113._12_4_ = 0x40000000;
    auVar113._16_4_ = 0x40000000;
    auVar113._20_4_ = 0x40000000;
    auVar113._24_4_ = 0x40000000;
    auVar113._28_4_ = 0x40000000;
    auVar97 = vaddps_avx512vl(auVar220._0_32_,auVar113);
    auVar125._4_4_ = (fVar238 + fVar238) * auVar97._4_4_;
    auVar125._0_4_ = (fVar237 + fVar237) * auVar97._0_4_;
    auVar125._8_4_ = (fVar253 + fVar253) * auVar97._8_4_;
    auVar125._12_4_ = (fVar210 + fVar210) * auVar97._12_4_;
    auVar125._16_4_ = (fVar240 + fVar240) * auVar97._16_4_;
    auVar125._20_4_ = (fVar155 + fVar155) * auVar97._20_4_;
    auVar125._24_4_ = (fVar244 + fVar244) * auVar97._24_4_;
    auVar125._28_4_ = auVar97._28_4_;
    auVar126._4_4_ = fVar238 * 3.0 * fVar238;
    auVar126._0_4_ = fVar237 * 3.0 * fVar237;
    auVar126._8_4_ = fVar253 * 3.0 * fVar253;
    auVar126._12_4_ = fVar210 * 3.0 * fVar210;
    auVar126._16_4_ = fVar240 * 3.0 * fVar240;
    auVar126._20_4_ = fVar155 * 3.0 * fVar155;
    auVar126._24_4_ = fVar244 * 3.0 * fVar244;
    auVar126._28_4_ = fVar245;
    auVar97 = vsubps_avx(auVar125,auVar126);
    auVar83 = vsubps_avx(auVar260._0_32_,auVar124);
    auVar100 = vmulps_avx512vl(auVar96,auVar84);
    auVar102 = vmulps_avx512vl(auVar227,auVar84);
    auVar97 = vmulps_avx512vl(auVar97,auVar84);
    auVar83 = vmulps_avx512vl(auVar83,auVar84);
    auVar84 = vmulps_avx512vl(local_5e0,auVar83);
    fVar231 = auVar83._0_4_;
    fVar234 = auVar83._4_4_;
    auVar127._4_4_ = local_600._4_4_ * fVar234;
    auVar127._0_4_ = local_600._0_4_ * fVar231;
    fVar235 = auVar83._8_4_;
    auVar127._8_4_ = local_600._8_4_ * fVar235;
    fVar236 = auVar83._12_4_;
    auVar127._12_4_ = local_600._12_4_ * fVar236;
    fVar237 = auVar83._16_4_;
    auVar127._16_4_ = local_600._16_4_ * fVar237;
    fVar238 = auVar83._20_4_;
    auVar127._20_4_ = local_600._20_4_ * fVar238;
    fVar253 = auVar83._24_4_;
    auVar127._24_4_ = local_600._24_4_ * fVar253;
    auVar127._28_4_ = local_600._28_4_;
    auVar35._4_4_ = fVar234 * local_560._4_4_;
    auVar35._0_4_ = fVar231 * local_560._0_4_;
    auVar35._8_4_ = fVar235 * local_560._8_4_;
    auVar35._12_4_ = fVar236 * local_560._12_4_;
    auVar35._16_4_ = fVar237 * local_560._16_4_;
    auVar35._20_4_ = fVar238 * local_560._20_4_;
    auVar35._24_4_ = fVar253 * local_560._24_4_;
    auVar35._28_4_ = fVar245 + fVar245;
    auVar36._4_4_ = fVar234 * (float)local_580._4_4_;
    auVar36._0_4_ = fVar231 * (float)local_580._0_4_;
    auVar36._8_4_ = fVar235 * fStack_578;
    auVar36._12_4_ = fVar236 * fStack_574;
    auVar36._16_4_ = fVar237 * fStack_570;
    auVar36._20_4_ = fVar238 * fStack_56c;
    auVar36._24_4_ = fVar253 * fStack_568;
    auVar36._28_4_ = auVar83._28_4_;
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar83 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar95);
    auVar84 = vfmadd231ps_avx512vl(auVar127,auVar97,auVar175._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar35,auVar97,local_520);
    auVar74 = vfmadd231ps_fma(auVar36,local_540,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar83,auVar102,auVar91);
    auVar83 = vfmadd231ps_avx512vl(auVar84,auVar102,auVar92);
    auVar84 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar93);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,auVar102);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar100,auVar89);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,auVar138._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar100);
    auVar130._4_4_ = auVar97._4_4_ * fVar239;
    auVar130._0_4_ = auVar97._0_4_ * fVar239;
    auVar130._8_4_ = auVar97._8_4_ * fVar239;
    auVar130._12_4_ = auVar97._12_4_ * fVar239;
    auVar130._16_4_ = auVar97._16_4_ * fVar239;
    auVar130._20_4_ = auVar97._20_4_ * fVar239;
    auVar130._24_4_ = auVar97._24_4_ * fVar239;
    auVar130._28_4_ = auVar96._28_4_;
    auVar37._4_4_ = auVar83._4_4_ * fVar239;
    auVar37._0_4_ = auVar83._0_4_ * fVar239;
    auVar37._8_4_ = auVar83._8_4_ * fVar239;
    auVar37._12_4_ = auVar83._12_4_ * fVar239;
    auVar37._16_4_ = auVar83._16_4_ * fVar239;
    auVar37._20_4_ = auVar83._20_4_ * fVar239;
    auVar37._24_4_ = auVar83._24_4_ * fVar239;
    auVar37._28_4_ = auVar83._28_4_;
    auVar38._4_4_ = auVar84._4_4_ * fVar239;
    auVar38._0_4_ = auVar84._0_4_ * fVar239;
    auVar38._8_4_ = auVar84._8_4_ * fVar239;
    auVar38._12_4_ = auVar84._12_4_ * fVar239;
    auVar38._16_4_ = auVar84._16_4_ * fVar239;
    auVar38._20_4_ = auVar84._20_4_ * fVar239;
    auVar38._24_4_ = auVar84._24_4_ * fVar239;
    auVar38._28_4_ = auVar84._28_4_;
    fVar231 = auVar100._0_4_ * fVar239;
    fVar234 = auVar100._4_4_ * fVar239;
    auVar39._4_4_ = fVar234;
    auVar39._0_4_ = fVar231;
    fVar235 = auVar100._8_4_ * fVar239;
    auVar39._8_4_ = fVar235;
    fVar236 = auVar100._12_4_ * fVar239;
    auVar39._12_4_ = fVar236;
    fVar237 = auVar100._16_4_ * fVar239;
    auVar39._16_4_ = fVar237;
    fVar238 = auVar100._20_4_ * fVar239;
    auVar39._20_4_ = fVar238;
    fVar239 = auVar100._24_4_ * fVar239;
    auVar39._24_4_ = fVar239;
    auVar39._28_4_ = fStack_564;
    auVar74 = vxorps_avx512vl(auVar175._0_16_,auVar175._0_16_);
    auVar100 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar74));
    auVar246 = ZEXT3264(auVar100);
    auVar105 = vpermt2ps_avx512vl(local_800,_DAT_0205fd20,ZEXT1632(auVar74));
    auVar83 = ZEXT1632(auVar74);
    auVar102 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar83);
    auVar228._0_4_ = auVar99._0_4_ + fVar231;
    auVar228._4_4_ = auVar99._4_4_ + fVar234;
    auVar228._8_4_ = auVar99._8_4_ + fVar235;
    auVar228._12_4_ = auVar99._12_4_ + fVar236;
    auVar228._16_4_ = auVar99._16_4_ + fVar237;
    auVar228._20_4_ = auVar99._20_4_ + fVar238;
    auVar228._24_4_ = auVar99._24_4_ + fVar239;
    auVar228._28_4_ = auVar99._28_4_ + fStack_564;
    auVar96 = vmaxps_avx(auVar99,auVar228);
    auVar97 = vminps_avx(auVar99,auVar228);
    auVar99 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,auVar83);
    auVar104 = vpermt2ps_avx512vl(auVar130,_DAT_0205fd20,auVar83);
    auVar106 = vpermt2ps_avx512vl(auVar37,_DAT_0205fd20,auVar83);
    auVar120 = ZEXT1632(auVar74);
    auVar107 = vpermt2ps_avx512vl(auVar38,_DAT_0205fd20,auVar120);
    auVar83 = vpermt2ps_avx512vl(auVar39,_DAT_0205fd20,auVar120);
    auVar108 = vsubps_avx512vl(auVar99,auVar83);
    auVar83 = vsubps_avx(auVar100,auVar101);
    auVar84 = vsubps_avx(auVar105,local_800);
    auVar233 = ZEXT3264(auVar84);
    auVar109 = vsubps_avx512vl(auVar102,auVar98);
    auVar110 = vmulps_avx512vl(auVar84,auVar38);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar37,auVar109);
    auVar111 = vmulps_avx512vl(auVar109,auVar130);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar38,auVar83);
    auVar112 = vmulps_avx512vl(auVar83,auVar37);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar130,auVar84);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar84,auVar84);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar83,auVar83);
    auVar112 = vrcp14ps_avx512vl(auVar111);
    auVar113 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar103);
    auVar112 = vfmadd132ps_avx512vl(auVar113,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar110,auVar112);
    auVar113 = vmulps_avx512vl(auVar84,auVar107);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar106,auVar109);
    auVar114 = vmulps_avx512vl(auVar109,auVar104);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar83);
    auVar115 = vmulps_avx512vl(auVar83,auVar106);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar104,auVar84);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vmulps_avx512vl(auVar113,auVar112);
    auVar110 = vmaxps_avx512vl(auVar110,auVar112);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar112 = vmaxps_avx512vl(auVar108,auVar99);
    auVar96 = vmaxps_avx512vl(auVar96,auVar112);
    auVar112 = vaddps_avx512vl(auVar110,auVar96);
    auVar96 = vminps_avx512vl(auVar108,auVar99);
    auVar96 = vminps_avx(auVar97,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar110);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar97 = vmulps_avx512vl(auVar112,auVar114);
    auVar115._8_4_ = 0x3f7ffffc;
    auVar115._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar115._12_4_ = 0x3f7ffffc;
    auVar115._16_4_ = 0x3f7ffffc;
    auVar115._20_4_ = 0x3f7ffffc;
    auVar115._24_4_ = 0x3f7ffffc;
    auVar115._28_4_ = 0x3f7ffffc;
    auVar96 = vmulps_avx512vl(auVar96,auVar115);
    auVar40._4_4_ = auVar97._4_4_ * auVar97._4_4_;
    auVar40._0_4_ = auVar97._0_4_ * auVar97._0_4_;
    auVar40._8_4_ = auVar97._8_4_ * auVar97._8_4_;
    auVar40._12_4_ = auVar97._12_4_ * auVar97._12_4_;
    auVar40._16_4_ = auVar97._16_4_ * auVar97._16_4_;
    auVar40._20_4_ = auVar97._20_4_ * auVar97._20_4_;
    auVar40._24_4_ = auVar97._24_4_ * auVar97._24_4_;
    auVar40._28_4_ = auVar96._28_4_;
    auVar97 = vrsqrt14ps_avx512vl(auVar111);
    auVar116._8_4_ = 0xbf000000;
    auVar116._0_8_ = 0xbf000000bf000000;
    auVar116._12_4_ = 0xbf000000;
    auVar116._16_4_ = 0xbf000000;
    auVar116._20_4_ = 0xbf000000;
    auVar116._24_4_ = 0xbf000000;
    auVar116._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar111,auVar116);
    auVar41._4_4_ = auVar97._4_4_ * auVar99._4_4_;
    auVar41._0_4_ = auVar97._0_4_ * auVar99._0_4_;
    auVar41._8_4_ = auVar97._8_4_ * auVar99._8_4_;
    auVar41._12_4_ = auVar97._12_4_ * auVar99._12_4_;
    auVar41._16_4_ = auVar97._16_4_ * auVar99._16_4_;
    auVar41._20_4_ = auVar97._20_4_ * auVar99._20_4_;
    auVar41._24_4_ = auVar97._24_4_ * auVar99._24_4_;
    auVar41._28_4_ = auVar99._28_4_;
    auVar99 = vmulps_avx512vl(auVar97,auVar97);
    auVar99 = vmulps_avx512vl(auVar99,auVar41);
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar117);
    auVar42._4_4_ = auVar99._4_4_ * auVar83._4_4_;
    auVar42._0_4_ = auVar99._0_4_ * auVar83._0_4_;
    auVar42._8_4_ = auVar99._8_4_ * auVar83._8_4_;
    auVar42._12_4_ = auVar99._12_4_ * auVar83._12_4_;
    auVar42._16_4_ = auVar99._16_4_ * auVar83._16_4_;
    auVar42._20_4_ = auVar99._20_4_ * auVar83._20_4_;
    auVar42._24_4_ = auVar99._24_4_ * auVar83._24_4_;
    auVar42._28_4_ = auVar97._28_4_;
    auVar97 = vmulps_avx512vl(auVar84,auVar99);
    auVar108 = vmulps_avx512vl(auVar109,auVar99);
    auVar110 = vsubps_avx512vl(auVar120,auVar101);
    auVar111 = vsubps_avx512vl(auVar120,local_800);
    auVar112 = vsubps_avx512vl(auVar120,auVar98);
    auVar113 = vmulps_avx512vl(local_6a0,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar87,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar86,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(local_6a0,auVar108);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar97,auVar87);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar42,auVar86);
    auVar108 = vmulps_avx512vl(auVar112,auVar108);
    auVar97 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar42);
    local_820 = vmulps_avx512vl(auVar115,auVar115);
    auVar108 = vsubps_avx512vl(local_5a0,local_820);
    auVar116 = vmulps_avx512vl(auVar115,auVar97);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar97,auVar97);
    auVar114 = vsubps_avx512vl(auVar114,auVar116);
    auVar116 = vsubps_avx512vl(auVar114,auVar40);
    auVar117 = vmulps_avx512vl(auVar113,auVar113);
    auVar118._8_4_ = 0x40800000;
    auVar118._0_8_ = 0x4080000040800000;
    auVar118._12_4_ = 0x40800000;
    auVar118._16_4_ = 0x40800000;
    auVar118._20_4_ = 0x40800000;
    auVar118._24_4_ = 0x40800000;
    auVar118._28_4_ = 0x40800000;
    auVar118 = vmulps_avx512vl(auVar108,auVar118);
    auVar119 = vmulps_avx512vl(auVar118,auVar116);
    auVar119 = vsubps_avx512vl(auVar117,auVar119);
    uVar70 = vcmpps_avx512vl(auVar119,auVar120,5);
    bVar56 = (byte)uVar70;
    if (bVar56 == 0) {
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar119 = vsqrtps_avx512vl(auVar119);
      auVar120 = vaddps_avx512vl(auVar108,auVar108);
      auVar121 = vrcp14ps_avx512vl(auVar120);
      auVar120 = vfnmadd213ps_avx512vl(auVar120,auVar121,auVar103);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar121,auVar121);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      auVar121 = vxorps_avx512vl(auVar113,auVar24);
      auVar121 = vsubps_avx512vl(auVar121,auVar119);
      auVar121 = vmulps_avx512vl(auVar121,auVar120);
      auVar119 = vsubps_avx512vl(auVar119,auVar113);
      auVar119 = vmulps_avx512vl(auVar119,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar115,auVar121,auVar97);
      local_700 = vmulps_avx512vl(auVar99,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar115,auVar119,auVar97);
      local_720 = vmulps_avx512vl(auVar99,auVar120);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vblendmps_avx512vl(auVar120,auVar121);
      auVar122._0_4_ =
           (uint)(bVar56 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar56 & 1) * local_720._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar69 * auVar120._4_4_ | (uint)!bVar69 * local_720._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar69 * auVar120._8_4_ | (uint)!bVar69 * local_720._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar69 * auVar120._12_4_ | (uint)!bVar69 * local_720._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar69 * auVar120._16_4_ | (uint)!bVar69 * local_720._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar69 * auVar120._20_4_ | (uint)!bVar69 * local_720._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar69 * auVar120._24_4_ | (uint)!bVar69 * local_720._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar122._28_4_ = (uint)bVar69 * auVar120._28_4_ | (uint)!bVar69 * local_720._28_4_;
      auVar217._8_4_ = 0xff800000;
      auVar217._0_8_ = 0xff800000ff800000;
      auVar217._12_4_ = 0xff800000;
      auVar217._16_4_ = 0xff800000;
      auVar217._20_4_ = 0xff800000;
      auVar217._24_4_ = 0xff800000;
      auVar217._28_4_ = 0xff800000;
      auVar120 = vblendmps_avx512vl(auVar217,auVar119);
      auVar123._0_4_ =
           (uint)(bVar56 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar119._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar69 * auVar120._4_4_ | (uint)!bVar69 * auVar119._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar69 * auVar120._8_4_ | (uint)!bVar69 * auVar119._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar69 * auVar120._12_4_ | (uint)!bVar69 * auVar119._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar69 * auVar120._16_4_ | (uint)!bVar69 * auVar119._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar69 * auVar120._20_4_ | (uint)!bVar69 * auVar119._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar69 * auVar120._24_4_ | (uint)!bVar69 * auVar119._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar123._28_4_ = (uint)bVar69 * auVar120._28_4_ | (uint)!bVar69 * auVar119._28_4_;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_820,auVar119);
      auVar120 = vmaxps_avx512vl(local_6c0,auVar119);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      auVar120 = vmulps_avx512vl(auVar120,auVar25);
      vandps_avx512vl(auVar108,auVar119);
      uVar62 = vcmpps_avx512vl(auVar120,auVar120,1);
      uVar70 = uVar70 & uVar62;
      bVar64 = (byte)uVar70;
      if (bVar64 != 0) {
        uVar62 = vcmpps_avx512vl(auVar116,_DAT_02020f00,2);
        auVar230._8_4_ = 0xff800000;
        auVar230._0_8_ = 0xff800000ff800000;
        auVar230._12_4_ = 0xff800000;
        auVar230._16_4_ = 0xff800000;
        auVar230._20_4_ = 0xff800000;
        auVar230._24_4_ = 0xff800000;
        auVar230._28_4_ = 0xff800000;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar119 = vblendmps_avx512vl(auVar116,auVar230);
        bVar58 = (byte)uVar62;
        uVar71 = (uint)(bVar58 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar120._0_4_;
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        uVar146 = (uint)bVar69 * auVar119._4_4_ | (uint)!bVar69 * auVar120._4_4_;
        bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
        uVar147 = (uint)bVar69 * auVar119._8_4_ | (uint)!bVar69 * auVar120._8_4_;
        bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
        uVar148 = (uint)bVar69 * auVar119._12_4_ | (uint)!bVar69 * auVar120._12_4_;
        bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
        uVar149 = (uint)bVar69 * auVar119._16_4_ | (uint)!bVar69 * auVar120._16_4_;
        bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
        uVar150 = (uint)bVar69 * auVar119._20_4_ | (uint)!bVar69 * auVar120._20_4_;
        bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
        uVar151 = (uint)bVar69 * auVar119._24_4_ | (uint)!bVar69 * auVar120._24_4_;
        bVar69 = SUB81(uVar62 >> 7,0);
        uVar152 = (uint)bVar69 * auVar119._28_4_ | (uint)!bVar69 * auVar120._28_4_;
        auVar122._0_4_ = (bVar64 & 1) * uVar71 | !(bool)(bVar64 & 1) * auVar122._0_4_;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar122._4_4_ = bVar69 * uVar146 | !bVar69 * auVar122._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar122._8_4_ = bVar69 * uVar147 | !bVar69 * auVar122._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar122._12_4_ = bVar69 * uVar148 | !bVar69 * auVar122._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar122._16_4_ = bVar69 * uVar149 | !bVar69 * auVar122._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar122._20_4_ = bVar69 * uVar150 | !bVar69 * auVar122._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar122._24_4_ = bVar69 * uVar151 | !bVar69 * auVar122._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar122._28_4_ = bVar69 * uVar152 | !bVar69 * auVar122._28_4_;
        auVar116 = vblendmps_avx512vl(auVar230,auVar116);
        bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar14 = SUB81(uVar62 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar58 & 1) * auVar116._0_4_ | !(bool)(bVar58 & 1) * uVar71) |
             !(bool)(bVar64 & 1) * auVar123._0_4_;
        bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar8 * ((uint)bVar69 * auVar116._4_4_ | !bVar69 * uVar146) |
             !bVar8 * auVar123._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar69 * ((uint)bVar9 * auVar116._8_4_ | !bVar9 * uVar147) |
             !bVar69 * auVar123._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar69 * ((uint)bVar10 * auVar116._12_4_ | !bVar10 * uVar148) |
             !bVar69 * auVar123._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar69 * ((uint)bVar11 * auVar116._16_4_ | !bVar11 * uVar149) |
             !bVar69 * auVar123._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar69 * ((uint)bVar12 * auVar116._20_4_ | !bVar12 * uVar150) |
             !bVar69 * auVar123._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar69 * ((uint)bVar13 * auVar116._24_4_ | !bVar13 * uVar151) |
             !bVar69 * auVar123._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar69 * ((uint)bVar14 * auVar116._28_4_ | !bVar14 * uVar152) |
             !bVar69 * auVar123._28_4_;
        bVar56 = (~bVar64 | bVar58) & bVar56;
      }
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = &DAT_3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar103._16_4_ = 0x3f800000;
      auVar103._20_4_ = 0x3f800000;
      auVar103._24_4_ = 0x3f800000;
      auVar103._28_4_ = 0x3f800000;
    }
    if ((bVar56 & 0x7f) == 0) {
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar260 = ZEXT3264(auVar96);
LAB_01f18f92:
      auVar255 = ZEXT3264(auVar130);
      auVar249 = ZEXT3264(auVar105);
      auVar220 = ZEXT3264(auVar103);
      auVar175._32_32_ = auVar85;
      auVar145 = auVar175;
    }
    else {
      fVar231 = *(float *)(ray + k * 4 + 0x200) - (float)local_8b0._0_4_;
      auVar218._4_4_ = fVar231;
      auVar218._0_4_ = fVar231;
      auVar218._8_4_ = fVar231;
      auVar218._12_4_ = fVar231;
      auVar218._16_4_ = fVar231;
      auVar218._20_4_ = fVar231;
      auVar218._24_4_ = fVar231;
      auVar218._28_4_ = fVar231;
      auVar116 = vminps_avx512vl(auVar218,auVar123);
      auVar55._4_4_ = fStack_5bc;
      auVar55._0_4_ = local_5c0;
      auVar55._8_4_ = fStack_5b8;
      auVar55._12_4_ = fStack_5b4;
      auVar55._16_4_ = fStack_5b0;
      auVar55._20_4_ = fStack_5ac;
      auVar55._24_4_ = fStack_5a8;
      auVar55._28_4_ = fStack_5a4;
      auVar119 = vmaxps_avx512vl(auVar55,auVar122);
      auVar112 = vmulps_avx512vl(auVar112,auVar38);
      auVar111 = vfmadd213ps_avx512vl(auVar111,auVar37,auVar112);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar130,auVar111);
      auVar111 = vmulps_avx512vl(local_6a0,auVar38);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar87,auVar37);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar86,auVar130);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar260 = ZEXT3264(auVar120);
      vandps_avx512vl(auVar111,auVar120);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar120,auVar121,1);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar110 = vxorps_avx512vl(auVar110,auVar124);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar125 = vxorps_avx512vl(auVar111,auVar124);
      auVar126 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar103);
      auVar126 = vfmadd132ps_avx512vl(auVar126,auVar112,auVar112);
      auVar126 = vmulps_avx512vl(auVar126,auVar110);
      uVar18 = vcmpps_avx512vl(auVar111,auVar125,1);
      bVar64 = (byte)uVar16 | (byte)uVar18;
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar126,auVar127);
      auVar128._0_4_ =
           (uint)(bVar64 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar112._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * auVar112._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * auVar112._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * auVar112._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * auVar112._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * auVar112._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * auVar112._24_4_;
      auVar128._28_4_ =
           (uint)(bVar64 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar112._28_4_;
      auVar110 = vmaxps_avx(auVar119,auVar128);
      uVar18 = vcmpps_avx512vl(auVar111,auVar125,6);
      bVar64 = (byte)uVar16 | (byte)uVar18;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar129._0_4_ =
           (uint)(bVar64 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar126._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar69 * auVar119._4_4_ | (uint)!bVar69 * auVar126._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar69 * auVar119._8_4_ | (uint)!bVar69 * auVar126._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar69 * auVar119._12_4_ | (uint)!bVar69 * auVar126._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar69 * auVar119._16_4_ | (uint)!bVar69 * auVar126._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar69 * auVar119._20_4_ | (uint)!bVar69 * auVar126._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar69 * auVar119._24_4_ | (uint)!bVar69 * auVar126._24_4_;
      auVar129._28_4_ =
           (uint)(bVar64 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar126._28_4_;
      auVar111 = vminps_avx(auVar116,auVar129);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
      auVar112 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
      auVar116 = ZEXT832(0) << 0x20;
      auVar102 = vsubps_avx(auVar116,auVar102);
      auVar43._4_4_ = auVar102._4_4_ * auVar107._4_4_;
      auVar43._0_4_ = auVar102._0_4_ * auVar107._0_4_;
      auVar43._8_4_ = auVar102._8_4_ * auVar107._8_4_;
      auVar43._12_4_ = auVar102._12_4_ * auVar107._12_4_;
      auVar43._16_4_ = auVar102._16_4_ * auVar107._16_4_;
      auVar43._20_4_ = auVar102._20_4_ * auVar107._20_4_;
      auVar43._24_4_ = auVar102._24_4_ * auVar107._24_4_;
      auVar43._28_4_ = auVar102._28_4_;
      auVar102 = vfnmsub231ps_avx512vl(auVar43,auVar106,auVar112);
      auVar100 = vfnmadd231ps_avx512vl(auVar102,auVar104,auVar100);
      auVar102 = vmulps_avx512vl(local_6a0,auVar107);
      auVar102 = vfnmsub231ps_avx512vl(auVar102,auVar87,auVar106);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar86,auVar104);
      vandps_avx512vl(auVar102,auVar120);
      uVar16 = vcmpps_avx512vl(auVar102,auVar121,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar124);
      auVar104 = vrcp14ps_avx512vl(auVar102);
      auVar130 = vxorps_avx512vl(auVar102,auVar124);
      auVar107 = vfnmadd213ps_avx512vl(auVar104,auVar102,auVar103);
      auVar74 = vfmadd132ps_fma(auVar107,auVar104,auVar104);
      fVar231 = auVar74._0_4_ * auVar100._0_4_;
      fVar234 = auVar74._4_4_ * auVar100._4_4_;
      auVar44._4_4_ = fVar234;
      auVar44._0_4_ = fVar231;
      fVar235 = auVar74._8_4_ * auVar100._8_4_;
      auVar44._8_4_ = fVar235;
      fVar236 = auVar74._12_4_ * auVar100._12_4_;
      auVar44._12_4_ = fVar236;
      fVar237 = auVar100._16_4_ * 0.0;
      auVar44._16_4_ = fVar237;
      fVar238 = auVar100._20_4_ * 0.0;
      auVar44._20_4_ = fVar238;
      fVar253 = auVar100._24_4_ * 0.0;
      auVar44._24_4_ = fVar253;
      auVar44._28_4_ = auVar100._28_4_;
      uVar18 = vcmpps_avx512vl(auVar102,auVar130,1);
      bVar64 = (byte)uVar16 | (byte)uVar18;
      auVar107 = vblendmps_avx512vl(auVar44,auVar127);
      auVar131._0_4_ =
           (uint)(bVar64 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar104._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * auVar104._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * auVar104._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * auVar104._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * auVar104._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * auVar104._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * auVar104._24_4_;
      auVar131._28_4_ =
           (uint)(bVar64 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar104._28_4_;
      _local_840 = vmaxps_avx(auVar110,auVar131);
      uVar18 = vcmpps_avx512vl(auVar102,auVar130,6);
      bVar64 = (byte)uVar16 | (byte)uVar18;
      auVar105._0_4_ =
           (uint)(bVar64 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar231;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar69 * auVar119._4_4_ | (uint)!bVar69 * (int)fVar234;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar69 * auVar119._8_4_ | (uint)!bVar69 * (int)fVar235;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar69 * auVar119._12_4_ | (uint)!bVar69 * (int)fVar236;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar69 * auVar119._16_4_ | (uint)!bVar69 * (int)fVar237;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar69 * auVar119._20_4_ | (uint)!bVar69 * (int)fVar238;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar69 * auVar119._24_4_ | (uint)!bVar69 * (int)fVar253;
      auVar105._28_4_ =
           (uint)(bVar64 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar100._28_4_;
      local_660 = vminps_avx(auVar111,auVar105);
      auVar246 = ZEXT3264(local_660);
      uVar16 = vcmpps_avx512vl(_local_840,local_660,2);
      bVar56 = bVar56 & 0x7f & (byte)uVar16;
      if (bVar56 == 0) goto LAB_01f18f92;
      auVar96 = vmaxps_avx(auVar116,auVar96);
      auVar100 = vminps_avx512vl(local_700,auVar103);
      auVar50 = ZEXT412(0);
      auVar102 = ZEXT1232(auVar50) << 0x20;
      auVar100 = vmaxps_avx(auVar100,ZEXT1232(auVar50) << 0x20);
      auVar104 = vminps_avx512vl(local_720,auVar103);
      auVar45._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar100._28_4_ + 7.0;
      local_700 = vfmadd213ps_avx512vl(auVar45,auVar165,auVar226);
      auVar100 = vmaxps_avx(auVar104,ZEXT1232(auVar50) << 0x20);
      auVar46._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar100._28_4_ + 7.0;
      local_720 = vfmadd213ps_avx512vl(auVar46,auVar165,auVar226);
      auVar47._4_4_ = auVar96._4_4_ * auVar96._4_4_;
      auVar47._0_4_ = auVar96._0_4_ * auVar96._0_4_;
      auVar47._8_4_ = auVar96._8_4_ * auVar96._8_4_;
      auVar47._12_4_ = auVar96._12_4_ * auVar96._12_4_;
      auVar47._16_4_ = auVar96._16_4_ * auVar96._16_4_;
      auVar47._20_4_ = auVar96._20_4_ * auVar96._20_4_;
      auVar47._24_4_ = auVar96._24_4_ * auVar96._24_4_;
      auVar47._28_4_ = local_720._28_4_;
      auVar96 = vsubps_avx(auVar114,auVar47);
      auVar255 = ZEXT3264(auVar96);
      auVar100 = vmulps_avx512vl(auVar118,auVar96);
      auVar100 = vsubps_avx(auVar117,auVar100);
      uVar16 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar50) << 0x20,5);
      bVar64 = (byte)uVar16;
      if (bVar64 == 0) {
        auVar97 = ZEXT832(0) << 0x20;
        auVar83 = ZEXT832(0) << 0x20;
        auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar249 = ZEXT864(0) << 0x20;
        auVar132._8_4_ = 0x7f800000;
        auVar132._0_8_ = 0x7f8000007f800000;
        auVar132._12_4_ = 0x7f800000;
        auVar132._16_4_ = 0x7f800000;
        auVar132._20_4_ = 0x7f800000;
        auVar132._24_4_ = 0x7f800000;
        auVar132._28_4_ = 0x7f800000;
        auVar133._8_4_ = 0xff800000;
        auVar133._0_8_ = 0xff800000ff800000;
        auVar133._12_4_ = 0xff800000;
        auVar133._16_4_ = 0xff800000;
        auVar133._20_4_ = 0xff800000;
        auVar133._24_4_ = 0xff800000;
        auVar133._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
        uVar70 = vcmpps_avx512vl(auVar100,auVar116,5);
        auVar100 = vsqrtps_avx(auVar100);
        auVar229._0_4_ = auVar108._0_4_ + auVar108._0_4_;
        auVar229._4_4_ = auVar108._4_4_ + auVar108._4_4_;
        auVar229._8_4_ = auVar108._8_4_ + auVar108._8_4_;
        auVar229._12_4_ = auVar108._12_4_ + auVar108._12_4_;
        auVar229._16_4_ = auVar108._16_4_ + auVar108._16_4_;
        auVar229._20_4_ = auVar108._20_4_ + auVar108._20_4_;
        auVar229._24_4_ = auVar108._24_4_ + auVar108._24_4_;
        auVar229._28_4_ = auVar108._28_4_ + auVar108._28_4_;
        auVar102 = vrcp14ps_avx512vl(auVar229);
        auVar104 = vfnmadd213ps_avx512vl(auVar229,auVar102,auVar103);
        auVar74 = vfmadd132ps_fma(auVar104,auVar102,auVar102);
        auVar26._8_4_ = 0x80000000;
        auVar26._0_8_ = 0x8000000080000000;
        auVar26._12_4_ = 0x80000000;
        auVar26._16_4_ = 0x80000000;
        auVar26._20_4_ = 0x80000000;
        auVar26._24_4_ = 0x80000000;
        auVar26._28_4_ = 0x80000000;
        auVar102 = vxorps_avx512vl(auVar113,auVar26);
        auVar102 = vsubps_avx(auVar102,auVar100);
        auVar48._4_4_ = auVar102._4_4_ * auVar74._4_4_;
        auVar48._0_4_ = auVar102._0_4_ * auVar74._0_4_;
        auVar48._8_4_ = auVar102._8_4_ * auVar74._8_4_;
        auVar48._12_4_ = auVar102._12_4_ * auVar74._12_4_;
        auVar48._16_4_ = auVar102._16_4_ * 0.0;
        auVar48._20_4_ = auVar102._20_4_ * 0.0;
        auVar48._24_4_ = auVar102._24_4_ * 0.0;
        auVar48._28_4_ = 0x3e000000;
        auVar100 = vsubps_avx512vl(auVar100,auVar113);
        auVar259._0_4_ = auVar100._0_4_ * auVar74._0_4_;
        auVar259._4_4_ = auVar100._4_4_ * auVar74._4_4_;
        auVar259._8_4_ = auVar100._8_4_ * auVar74._8_4_;
        auVar259._12_4_ = auVar100._12_4_ * auVar74._12_4_;
        auVar259._16_4_ = auVar100._16_4_ * 0.0;
        auVar259._20_4_ = auVar100._20_4_ * 0.0;
        auVar259._24_4_ = auVar100._24_4_ * 0.0;
        auVar259._28_4_ = 0;
        auVar100 = vfmadd213ps_avx512vl(auVar115,auVar48,auVar97);
        auVar49._4_4_ = auVar99._4_4_ * auVar100._4_4_;
        auVar49._0_4_ = auVar99._0_4_ * auVar100._0_4_;
        auVar49._8_4_ = auVar99._8_4_ * auVar100._8_4_;
        auVar49._12_4_ = auVar99._12_4_ * auVar100._12_4_;
        auVar49._16_4_ = auVar99._16_4_ * auVar100._16_4_;
        auVar49._20_4_ = auVar99._20_4_ * auVar100._20_4_;
        auVar49._24_4_ = auVar99._24_4_ * auVar100._24_4_;
        auVar49._28_4_ = auVar102._28_4_;
        auVar100 = vmulps_avx512vl(auVar86,auVar48);
        auVar102 = vmulps_avx512vl(auVar87,auVar48);
        auVar106 = vmulps_avx512vl(local_6a0,auVar48);
        auVar104 = vfmadd213ps_avx512vl(auVar83,auVar49,auVar101);
        auVar100 = vsubps_avx512vl(auVar100,auVar104);
        auVar104 = vfmadd213ps_avx512vl(auVar84,auVar49,local_800);
        auVar104 = vsubps_avx512vl(auVar102,auVar104);
        auVar74 = vfmadd213ps_fma(auVar49,auVar109,auVar98);
        auVar102 = vsubps_avx(auVar106,ZEXT1632(auVar74));
        auVar249 = ZEXT3264(auVar102);
        auVar97 = vfmadd213ps_avx512vl(auVar115,auVar259,auVar97);
        auVar99 = vmulps_avx512vl(auVar99,auVar97);
        auVar97 = vmulps_avx512vl(auVar86,auVar259);
        auVar106 = vmulps_avx512vl(auVar87,auVar259);
        auVar107 = vmulps_avx512vl(local_6a0,auVar259);
        auVar74 = vfmadd213ps_fma(auVar83,auVar99,auVar101);
        auVar102 = vsubps_avx(auVar97,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar84,auVar99,local_800);
        auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar109,auVar99,auVar98);
        auVar83 = vsubps_avx512vl(auVar107,ZEXT1632(auVar74));
        auVar166._8_4_ = 0x7f800000;
        auVar166._0_8_ = 0x7f8000007f800000;
        auVar166._12_4_ = 0x7f800000;
        auVar166._16_4_ = 0x7f800000;
        auVar166._20_4_ = 0x7f800000;
        auVar166._24_4_ = 0x7f800000;
        auVar166._28_4_ = 0x7f800000;
        auVar84 = vblendmps_avx512vl(auVar166,auVar48);
        bVar69 = (bool)((byte)uVar70 & 1);
        auVar132._0_4_ = (uint)bVar69 * auVar84._0_4_ | (uint)!bVar69 * auVar101._0_4_;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * auVar101._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * auVar101._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * auVar101._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * auVar101._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * auVar101._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * auVar101._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar132._28_4_ = (uint)bVar69 * auVar84._28_4_ | (uint)!bVar69 * auVar101._28_4_;
        auVar167._8_4_ = 0xff800000;
        auVar167._0_8_ = 0xff800000ff800000;
        auVar167._12_4_ = 0xff800000;
        auVar167._16_4_ = 0xff800000;
        auVar167._20_4_ = 0xff800000;
        auVar167._24_4_ = 0xff800000;
        auVar167._28_4_ = 0xff800000;
        auVar84 = vblendmps_avx512vl(auVar167,auVar259);
        bVar69 = (bool)((byte)uVar70 & 1);
        auVar133._0_4_ = (uint)bVar69 * auVar84._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar133._28_4_ = (uint)bVar69 * auVar84._28_4_ | (uint)!bVar69 * -0x800000;
        vandps_avx512vl(auVar120,local_820);
        auVar84 = vmaxps_avx(local_6c0,auVar133);
        auVar27._8_4_ = 0x36000000;
        auVar27._0_8_ = 0x3600000036000000;
        auVar27._12_4_ = 0x36000000;
        auVar27._16_4_ = 0x36000000;
        auVar27._20_4_ = 0x36000000;
        auVar27._24_4_ = 0x36000000;
        auVar27._28_4_ = 0x36000000;
        auVar84 = vmulps_avx512vl(auVar84,auVar27);
        vandps_avx512vl(auVar108,auVar120);
        uVar62 = vcmpps_avx512vl(auVar84,auVar84,1);
        uVar70 = uVar70 & uVar62;
        bVar58 = (byte)uVar70;
        if (bVar58 != 0) {
          uVar62 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar75),2);
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar255 = ZEXT3264(auVar254);
          auVar96 = vblendmps_avx512vl(auVar254,auVar243);
          bVar63 = (byte)uVar62;
          uVar71 = (uint)(bVar63 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar84._0_4_;
          bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
          uVar146 = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * auVar84._4_4_;
          bVar69 = (bool)((byte)(uVar62 >> 2) & 1);
          uVar147 = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * auVar84._8_4_;
          bVar69 = (bool)((byte)(uVar62 >> 3) & 1);
          uVar148 = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * auVar84._12_4_;
          bVar69 = (bool)((byte)(uVar62 >> 4) & 1);
          uVar149 = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * auVar84._16_4_;
          bVar69 = (bool)((byte)(uVar62 >> 5) & 1);
          uVar150 = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * auVar84._20_4_;
          bVar69 = (bool)((byte)(uVar62 >> 6) & 1);
          uVar151 = (uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * auVar84._24_4_;
          bVar69 = SUB81(uVar62 >> 7,0);
          uVar152 = (uint)bVar69 * auVar96._28_4_ | (uint)!bVar69 * auVar84._28_4_;
          auVar132._0_4_ = (bVar58 & 1) * uVar71 | !(bool)(bVar58 & 1) * auVar132._0_4_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar132._4_4_ = bVar69 * uVar146 | !bVar69 * auVar132._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar132._8_4_ = bVar69 * uVar147 | !bVar69 * auVar132._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar132._12_4_ = bVar69 * uVar148 | !bVar69 * auVar132._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar132._16_4_ = bVar69 * uVar149 | !bVar69 * auVar132._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar132._20_4_ = bVar69 * uVar150 | !bVar69 * auVar132._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar132._24_4_ = bVar69 * uVar151 | !bVar69 * auVar132._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar132._28_4_ = bVar69 * uVar152 | !bVar69 * auVar132._28_4_;
          auVar96 = vblendmps_avx512vl(auVar243,auVar254);
          bVar69 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar62 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
          bVar14 = SUB81(uVar62 >> 7,0);
          auVar133._0_4_ =
               (uint)(bVar58 & 1) *
               ((uint)(bVar63 & 1) * auVar96._0_4_ | !(bool)(bVar63 & 1) * uVar71) |
               !(bool)(bVar58 & 1) * auVar133._0_4_;
          bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar133._4_4_ =
               (uint)bVar8 * ((uint)bVar69 * auVar96._4_4_ | !bVar69 * uVar146) |
               !bVar8 * auVar133._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar133._8_4_ =
               (uint)bVar69 * ((uint)bVar9 * auVar96._8_4_ | !bVar9 * uVar147) |
               !bVar69 * auVar133._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar133._12_4_ =
               (uint)bVar69 * ((uint)bVar10 * auVar96._12_4_ | !bVar10 * uVar148) |
               !bVar69 * auVar133._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar133._16_4_ =
               (uint)bVar69 * ((uint)bVar11 * auVar96._16_4_ | !bVar11 * uVar149) |
               !bVar69 * auVar133._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar133._20_4_ =
               (uint)bVar69 * ((uint)bVar12 * auVar96._20_4_ | !bVar12 * uVar150) |
               !bVar69 * auVar133._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar133._24_4_ =
               (uint)bVar69 * ((uint)bVar13 * auVar96._24_4_ | !bVar13 * uVar151) |
               !bVar69 * auVar133._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar133._28_4_ =
               (uint)bVar69 * ((uint)bVar14 * auVar96._28_4_ | !bVar14 * uVar152) |
               !bVar69 * auVar133._28_4_;
          bVar64 = (~bVar58 | bVar63) & bVar64;
        }
      }
      auVar96 = vmulps_avx512vl(local_6a0,auVar83);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar97);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar86,auVar102);
      auVar233 = ZEXT3264(_local_840);
      _local_500 = _local_840;
      local_4e0 = vminps_avx(local_660,auVar132);
      vandps_avx512vl(auVar96,auVar120);
      _local_760 = vmaxps_avx(_local_840,auVar133);
      _local_680 = _local_760;
      auVar168._8_4_ = 0x3e99999a;
      auVar168._0_8_ = 0x3e99999a3e99999a;
      auVar168._12_4_ = 0x3e99999a;
      auVar168._16_4_ = 0x3e99999a;
      auVar168._20_4_ = 0x3e99999a;
      auVar168._24_4_ = 0x3e99999a;
      auVar168._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar96,auVar168,1);
      uVar18 = vcmpps_avx512vl(_local_840,local_4e0,2);
      bVar58 = (byte)uVar18 & bVar56;
      uVar17 = vcmpps_avx512vl(_local_760,local_660,2);
      auVar138._32_32_ = auVar85;
      auVar145 = auVar138;
      if ((bVar56 & ((byte)uVar17 | (byte)uVar18)) == 0) {
LAB_01f1aab8:
        auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
      else {
        auVar96 = vmulps_avx512vl(local_6a0,auVar249._0_32_);
        auVar96 = vfmadd213ps_avx512vl(auVar104,auVar87,auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar100,auVar86,auVar96);
        vandps_avx512vl(auVar96,auVar120);
        uVar18 = vcmpps_avx512vl(auVar96,auVar168,1);
        bVar63 = (byte)uVar18 | ~bVar64;
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar169,auVar28);
        local_640._0_4_ = (uint)(bVar63 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar69 = (bool)(bVar63 >> 1 & 1);
        local_640._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 2 & 1);
        local_640._8_4_ = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 3 & 1);
        local_640._12_4_ = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 4 & 1);
        local_640._16_4_ = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 5 & 1);
        local_640._20_4_ = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 6 & 1);
        local_640._24_4_ = (uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * 2;
        local_640._28_4_ = (uint)(bVar63 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
        auVar141._0_32_ = vpbroadcastd_avx512vl();
        auVar141._32_32_ = auVar85;
        local_6e0 = auVar141._0_32_;
        uVar18 = vpcmpd_avx512vl(auVar141._0_32_,local_640,5);
        bVar63 = (byte)uVar18 & bVar58;
        if (bVar63 == 0) {
          auVar223._8_4_ = 0x7fffffff;
          auVar223._0_8_ = 0x7fffffff7fffffff;
          auVar223._12_4_ = 0x7fffffff;
        }
        else {
          auVar75 = vminps_avx(local_900._0_16_,local_940._0_16_);
          auVar74 = vmaxps_avx(local_900._0_16_,local_940._0_16_);
          auVar82 = vminps_avx(local_920._0_16_,local_960._0_16_);
          auVar161 = vminps_avx(auVar75,auVar82);
          auVar75 = vmaxps_avx(local_920._0_16_,local_960._0_16_);
          auVar82 = vmaxps_avx(auVar74,auVar75);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar161,auVar195);
          auVar75 = vandps_avx(auVar82,auVar195);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar231 = auVar74._0_4_ * 1.9073486e-06;
          local_8c0 = vshufps_avx(auVar82,auVar82,0xff);
          local_740 = (float)local_840._0_4_ + (float)local_7e0._0_4_;
          fStack_73c = (float)local_840._4_4_ + (float)local_7e0._4_4_;
          fStack_738 = fStack_838 + fStack_7d8;
          fStack_734 = fStack_834 + fStack_7d4;
          fStack_730 = fStack_830 + fStack_7d0;
          fStack_72c = fStack_82c + fStack_7cc;
          fStack_728 = fStack_828 + fStack_7c8;
          fStack_724 = fStack_824 + fStack_7c4;
          do {
            auVar170._8_4_ = 0x7f800000;
            auVar170._0_8_ = 0x7f8000007f800000;
            auVar170._12_4_ = 0x7f800000;
            auVar170._16_4_ = 0x7f800000;
            auVar170._20_4_ = 0x7f800000;
            auVar170._24_4_ = 0x7f800000;
            auVar170._28_4_ = 0x7f800000;
            auVar85 = vblendmps_avx512vl(auVar170,_local_840);
            auVar134._0_4_ =
                 (uint)(bVar63 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar69 * auVar85._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar63 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar69 * auVar85._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar63 >> 6) * auVar85._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar141._0_32_ = auVar134;
            auVar85 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar85 = vminps_avx(auVar134,auVar85);
            auVar96 = vshufpd_avx(auVar85,auVar85,5);
            auVar85 = vminps_avx(auVar85,auVar96);
            auVar96 = vpermpd_avx2(auVar85,0x4e);
            auVar85 = vminps_avx(auVar85,auVar96);
            uVar18 = vcmpps_avx512vl(auVar134,auVar85,0);
            bVar57 = (byte)uVar18 & bVar63;
            bVar66 = bVar63;
            if (bVar57 != 0) {
              bVar66 = bVar57;
            }
            iVar19 = 0;
            for (uVar71 = (uint)bVar66; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar71 = *(uint *)(local_700 + (uint)(iVar19 << 2));
            uVar146 = *(uint *)(local_500 + (uint)(iVar19 << 2));
            fVar234 = auVar15._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar234 = sqrtf((float)local_980._0_4_);
            }
            auVar249 = ZEXT464(uVar71);
            auVar246 = ZEXT464(uVar146);
            bVar57 = ~bVar66;
            lVar68 = 5;
            do {
              auVar85 = auVar141._32_32_;
              fVar235 = auVar246._0_4_;
              auVar156._4_4_ = fVar235;
              auVar156._0_4_ = fVar235;
              auVar156._8_4_ = fVar235;
              auVar156._12_4_ = fVar235;
              auVar74 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_970);
              fVar210 = auVar249._0_4_;
              fVar239 = 1.0 - fVar210;
              auVar76 = SUB6416(ZEXT464(0x40400000),0);
              auVar73 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar248 = auVar249._0_16_;
              auVar82 = vfmadd213ss_fma(auVar76,auVar248,auVar73);
              auVar75 = vfmadd213ss_fma(auVar82,ZEXT416((uint)(fVar210 * fVar210)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar161 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar239),auVar73);
              auVar161 = vfmadd213ss_fma(auVar161,ZEXT416((uint)(fVar239 * fVar239)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar236 = fVar239 * fVar239 * -fVar210 * 0.5;
              fVar237 = auVar75._0_4_ * 0.5;
              fVar238 = auVar161._0_4_ * 0.5;
              fVar253 = fVar210 * fVar210 * -fVar239 * 0.5;
              auVar211._0_4_ = fVar253 * (float)local_960._0_4_;
              auVar211._4_4_ = fVar253 * (float)local_960._4_4_;
              auVar211._8_4_ = fVar253 * fStack_958;
              auVar211._12_4_ = fVar253 * fStack_954;
              auVar222._4_4_ = fVar238;
              auVar222._0_4_ = fVar238;
              auVar222._8_4_ = fVar238;
              auVar222._12_4_ = fVar238;
              auVar75 = vfmadd132ps_fma(auVar222,auVar211,local_920._0_16_);
              auVar196._4_4_ = fVar237;
              auVar196._0_4_ = fVar237;
              auVar196._8_4_ = fVar237;
              auVar196._12_4_ = fVar237;
              auVar75 = vfmadd132ps_fma(auVar196,auVar75,local_940._0_16_);
              auVar212._4_4_ = fVar236;
              auVar212._0_4_ = fVar236;
              auVar212._8_4_ = fVar236;
              auVar212._12_4_ = fVar236;
              auVar75 = vfmadd132ps_fma(auVar212,auVar75,local_900._0_16_);
              auVar161 = vfmadd231ss_fma(auVar73,auVar248,ZEXT416(0x41100000));
              local_820._0_16_ = auVar161;
              local_860 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar248,
                                          ZEXT416(0x40800000));
              local_870 = vfmadd213ss_fma(auVar76,auVar248,ZEXT416(0xbf800000));
              local_800._0_16_ = auVar75;
              auVar75 = vsubps_avx(auVar74,auVar75);
              auVar74 = vdpps_avx(auVar75,auVar75,0x7f);
              fVar236 = auVar74._0_4_;
              if (fVar236 < 0.0) {
                auVar246._0_4_ = sqrtf(fVar236);
                auVar246._4_60_ = extraout_var;
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar161 = auVar246._0_16_;
              }
              else {
                auVar161 = vsqrtss_avx(auVar74,auVar74);
              }
              auVar77 = vfnmadd231ss_fma(ZEXT416((uint)(fVar210 * (fVar239 + fVar239))),
                                         ZEXT416((uint)fVar239),ZEXT416((uint)fVar239));
              auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)(fVar210 + fVar210)),
                                        ZEXT416((uint)(fVar210 * fVar210 * 3.0)));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar248,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar239 * -3.0)),
                                        ZEXT416((uint)(fVar239 + fVar239)),auVar73);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(fVar239 * -2.0)),auVar248,
                                        ZEXT416((uint)(fVar210 * fVar210)));
              fVar237 = auVar77._0_4_ * 0.5;
              fVar238 = auVar82._0_4_ * 0.5;
              fVar253 = auVar76._0_4_ * 0.5;
              fVar239 = auVar73._0_4_ * 0.5;
              auVar213._0_4_ = fVar239 * (float)local_960._0_4_;
              auVar213._4_4_ = fVar239 * (float)local_960._4_4_;
              auVar213._8_4_ = fVar239 * fStack_958;
              auVar213._12_4_ = fVar239 * fStack_954;
              auVar197._4_4_ = fVar253;
              auVar197._0_4_ = fVar253;
              auVar197._8_4_ = fVar253;
              auVar197._12_4_ = fVar253;
              auVar82 = vfmadd132ps_fma(auVar197,auVar213,local_920._0_16_);
              auVar176._4_4_ = fVar238;
              auVar176._0_4_ = fVar238;
              auVar176._8_4_ = fVar238;
              auVar176._12_4_ = fVar238;
              auVar82 = vfmadd132ps_fma(auVar176,auVar82,local_940._0_16_);
              auVar256._4_4_ = fVar237;
              auVar256._0_4_ = fVar237;
              auVar256._8_4_ = fVar237;
              auVar256._12_4_ = fVar237;
              auVar73 = vfmadd132ps_fma(auVar256,auVar82,local_900._0_16_);
              auVar82 = vdpps_avx(auVar73,auVar73,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar237 = auVar82._0_4_;
              auVar76 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar237));
              fVar238 = auVar76._0_4_;
              auVar77 = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar237));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar82,auVar20);
              auVar76 = vfnmadd213ss_fma(auVar77,auVar82,SUB6416(ZEXT464(0x40000000),0));
              uVar71 = auVar161._0_4_;
              if (fVar237 < auVar78._0_4_) {
                fVar253 = sqrtf(fVar237);
                auVar161 = ZEXT416(uVar71);
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar253 = auVar82._0_4_;
              }
              fVar238 = fVar238 * 1.5 + fVar237 * -0.5 * fVar238 * fVar238 * fVar238;
              auVar157._0_4_ = auVar73._0_4_ * fVar238;
              auVar157._4_4_ = auVar73._4_4_ * fVar238;
              auVar157._8_4_ = auVar73._8_4_ * fVar238;
              auVar157._12_4_ = auVar73._12_4_ * fVar238;
              auVar82 = vdpps_avx(auVar75,auVar157,0x7f);
              fVar240 = auVar161._0_4_;
              auVar158._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar158._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar158._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar158._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar79 = vsubps_avx512vl(auVar74,auVar158);
              fVar239 = auVar79._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar239;
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar80 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
              if (fVar239 < 0.0) {
                local_8a0 = fVar238;
                fStack_89c = fVar238;
                fStack_898 = fVar238;
                fStack_894 = fVar238;
                local_890 = auVar78;
                local_880 = auVar82;
                fVar155 = sqrtf(fVar239);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar161 = ZEXT416(uVar71);
                auVar82 = local_880;
                auVar78 = local_890;
                fVar238 = local_8a0;
                fVar244 = fStack_89c;
                fVar245 = fStack_898;
                fVar247 = fStack_894;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar155 = auVar79._0_4_;
                fVar244 = fVar238;
                fVar245 = fVar238;
                fVar247 = fVar238;
              }
              auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar260 = ZEXT3264(auVar96);
              auVar249._32_32_ = auVar85;
              auVar249._0_32_ = auVar175._0_32_;
              auVar178._0_4_ = (float)local_870._0_4_ * (float)local_960._0_4_;
              auVar178._4_4_ = (float)local_870._0_4_ * (float)local_960._4_4_;
              auVar178._8_4_ = (float)local_870._0_4_ * fStack_958;
              auVar178._12_4_ = (float)local_870._0_4_ * fStack_954;
              auVar198._4_4_ = local_860._0_4_;
              auVar198._0_4_ = local_860._0_4_;
              auVar198._8_4_ = local_860._0_4_;
              auVar198._12_4_ = local_860._0_4_;
              auVar79 = vfmadd132ps_fma(auVar198,auVar178,local_920._0_16_);
              auVar179._4_4_ = local_820._0_4_;
              auVar179._0_4_ = local_820._0_4_;
              auVar179._8_4_ = local_820._0_4_;
              auVar179._12_4_ = local_820._0_4_;
              auVar79 = vfmadd132ps_fma(auVar179,auVar79,local_940._0_16_);
              auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar248,ZEXT416(0x40000000)
                                        );
              auVar199._0_4_ = auVar248._0_4_;
              auVar199._4_4_ = auVar199._0_4_;
              auVar199._8_4_ = auVar199._0_4_;
              auVar199._12_4_ = auVar199._0_4_;
              auVar248 = vfmadd132ps_fma(auVar199,auVar79,local_900._0_16_);
              auVar180._0_4_ = auVar248._0_4_ * fVar237;
              auVar180._4_4_ = auVar248._4_4_ * fVar237;
              auVar180._8_4_ = auVar248._8_4_ * fVar237;
              auVar180._12_4_ = auVar248._12_4_ * fVar237;
              auVar248 = vdpps_avx(auVar73,auVar248,0x7f);
              fVar237 = auVar248._0_4_;
              auVar200._0_4_ = auVar73._0_4_ * fVar237;
              auVar200._4_4_ = auVar73._4_4_ * fVar237;
              auVar200._8_4_ = auVar73._8_4_ * fVar237;
              auVar200._12_4_ = auVar73._12_4_ * fVar237;
              auVar248 = vsubps_avx(auVar180,auVar200);
              local_be0 = auVar77._0_4_;
              local_be0 = auVar76._0_4_ * local_be0;
              auVar77 = vmaxss_avx(ZEXT416((uint)fVar231),
                                   ZEXT416((uint)(fVar235 * fVar234 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar141._16_48_ = auVar249._16_48_;
              auVar81 = vxorps_avx512vl(auVar73,auVar21);
              auVar201._0_4_ = fVar238 * auVar248._0_4_ * local_be0;
              auVar201._4_4_ = fVar244 * auVar248._4_4_ * local_be0;
              auVar201._8_4_ = fVar245 * auVar248._8_4_ * local_be0;
              auVar201._12_4_ = fVar247 * auVar248._12_4_ * local_be0;
              auVar255 = ZEXT1664(auVar157);
              auVar76 = vdpps_avx(auVar81,auVar157,0x7f);
              auVar248 = vfmadd213ss_fma(auVar161,ZEXT416((uint)fVar231),auVar77);
              auVar161 = vdpps_avx(auVar75,auVar201,0x7f);
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 + 1.0)),
                                        ZEXT416((uint)(fVar231 / fVar253)),auVar248);
              fVar237 = auVar76._0_4_ + auVar161._0_4_;
              auVar161 = vdpps_avx(local_970,auVar157,0x7f);
              auVar76 = vdpps_avx(auVar75,auVar81,0x7f);
              fVar238 = auVar78._0_4_;
              auVar141._0_16_ =
                   vaddss_avx512f(auVar80,ZEXT416((uint)(fVar238 * fVar239 * -0.5 *
                                                        fVar238 * fVar238)));
              auVar248 = vdpps_avx(auVar75,local_970,0x7f);
              auVar78 = vfnmadd231ss_fma(auVar76,auVar82,ZEXT416((uint)fVar237));
              auVar80 = vfnmadd231ss_fma(auVar248,auVar82,auVar161);
              auVar76 = vpermilps_avx(local_800._0_16_,0xff);
              fVar155 = fVar155 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar73,auVar73,0xff);
              auVar248 = vfmsub213ss_fma(auVar78,auVar141._0_16_,auVar76);
              fVar238 = auVar80._0_4_ * auVar141._0_4_;
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar161._0_4_ * auVar248._0_4_)),
                                        ZEXT416((uint)fVar237),ZEXT416((uint)fVar238));
              fVar253 = auVar78._0_4_;
              fVar238 = auVar82._0_4_ * (fVar238 / fVar253);
              auVar233 = ZEXT464((uint)fVar238);
              fVar210 = fVar210 - (fVar238 - fVar155 * (auVar161._0_4_ / fVar253));
              auVar249 = ZEXT464((uint)fVar210);
              fVar235 = fVar235 - (fVar155 * (fVar237 / fVar253) -
                                  auVar82._0_4_ * (auVar248._0_4_ / fVar253));
              auVar246 = ZEXT464((uint)fVar235);
              auVar223._8_4_ = 0x7fffffff;
              auVar223._0_8_ = 0x7fffffff7fffffff;
              auVar223._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar82,auVar223);
              bVar69 = true;
              if (auVar82._0_4_ < auVar79._0_4_) {
                auVar161 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ + auVar77._0_4_)),local_8c0,
                                           ZEXT416(0x36000000));
                auVar82 = vandps_avx(ZEXT416((uint)fVar155),auVar223);
                if (auVar82._0_4_ < auVar161._0_4_) {
                  fVar235 = fVar235 + (float)local_8b0._0_4_;
                  auVar246 = ZEXT464((uint)fVar235);
                  if ((((fVar153 <= fVar235) &&
                       (fVar237 = *(float *)(ray + k * 4 + 0x200), fVar235 <= fVar237)) &&
                      (0.0 <= fVar210)) && (fVar210 <= 1.0)) {
                    auVar140._16_48_ = auVar141._16_48_;
                    auVar140._0_16_ = ZEXT816(0) << 0x20;
                    auVar139._4_60_ = auVar140._4_60_;
                    auVar139._0_4_ = fVar236;
                    auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar139._0_16_);
                    fVar236 = auVar82._0_4_;
                    auVar141._0_16_ = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar66 = true;
                      }
                      else {
                        fVar236 = fVar236 * 1.5 + auVar141._0_4_ * fVar236 * fVar236 * fVar236;
                        auVar181._0_4_ = auVar75._0_4_ * fVar236;
                        auVar181._4_4_ = auVar75._4_4_ * fVar236;
                        auVar181._8_4_ = auVar75._8_4_ * fVar236;
                        auVar181._12_4_ = auVar75._12_4_ * fVar236;
                        auVar161 = vfmadd213ps_fma(auVar76,auVar181,auVar73);
                        auVar74 = vshufps_avx(auVar181,auVar181,0xc9);
                        auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar182._0_4_ = auVar181._0_4_ * auVar75._0_4_;
                        auVar182._4_4_ = auVar181._4_4_ * auVar75._4_4_;
                        auVar182._8_4_ = auVar181._8_4_ * auVar75._8_4_;
                        auVar182._12_4_ = auVar181._12_4_ * auVar75._12_4_;
                        auVar82 = vfmsub231ps_fma(auVar182,auVar73,auVar74);
                        auVar74 = vshufps_avx(auVar82,auVar82,0xc9);
                        auVar75 = vshufps_avx(auVar161,auVar161,0xc9);
                        auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                        auVar159._0_4_ = auVar161._0_4_ * auVar82._0_4_;
                        auVar159._4_4_ = auVar161._4_4_ * auVar82._4_4_;
                        auVar159._8_4_ = auVar161._8_4_ * auVar82._8_4_;
                        auVar159._12_4_ = auVar161._12_4_ * auVar82._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar159,auVar74,auVar75);
                        auVar75 = ZEXT416((uint)fVar210);
                        local_340 = vbroadcastss_avx512f(auVar75);
                        auVar220 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar220 = vpermps_avx512f(auVar220,ZEXT1664(auVar74));
                        auVar145 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar145,ZEXT1664(auVar74));
                        local_380 = vbroadcastss_avx512f(auVar74);
                        local_400[0] = (RTCHitN)auVar220[0];
                        local_400[1] = (RTCHitN)auVar220[1];
                        local_400[2] = (RTCHitN)auVar220[2];
                        local_400[3] = (RTCHitN)auVar220[3];
                        local_400[4] = (RTCHitN)auVar220[4];
                        local_400[5] = (RTCHitN)auVar220[5];
                        local_400[6] = (RTCHitN)auVar220[6];
                        local_400[7] = (RTCHitN)auVar220[7];
                        local_400[8] = (RTCHitN)auVar220[8];
                        local_400[9] = (RTCHitN)auVar220[9];
                        local_400[10] = (RTCHitN)auVar220[10];
                        local_400[0xb] = (RTCHitN)auVar220[0xb];
                        local_400[0xc] = (RTCHitN)auVar220[0xc];
                        local_400[0xd] = (RTCHitN)auVar220[0xd];
                        local_400[0xe] = (RTCHitN)auVar220[0xe];
                        local_400[0xf] = (RTCHitN)auVar220[0xf];
                        local_400[0x10] = (RTCHitN)auVar220[0x10];
                        local_400[0x11] = (RTCHitN)auVar220[0x11];
                        local_400[0x12] = (RTCHitN)auVar220[0x12];
                        local_400[0x13] = (RTCHitN)auVar220[0x13];
                        local_400[0x14] = (RTCHitN)auVar220[0x14];
                        local_400[0x15] = (RTCHitN)auVar220[0x15];
                        local_400[0x16] = (RTCHitN)auVar220[0x16];
                        local_400[0x17] = (RTCHitN)auVar220[0x17];
                        local_400[0x18] = (RTCHitN)auVar220[0x18];
                        local_400[0x19] = (RTCHitN)auVar220[0x19];
                        local_400[0x1a] = (RTCHitN)auVar220[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar220[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar220[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar220[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar220[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar220[0x1f];
                        local_400[0x20] = (RTCHitN)auVar220[0x20];
                        local_400[0x21] = (RTCHitN)auVar220[0x21];
                        local_400[0x22] = (RTCHitN)auVar220[0x22];
                        local_400[0x23] = (RTCHitN)auVar220[0x23];
                        local_400[0x24] = (RTCHitN)auVar220[0x24];
                        local_400[0x25] = (RTCHitN)auVar220[0x25];
                        local_400[0x26] = (RTCHitN)auVar220[0x26];
                        local_400[0x27] = (RTCHitN)auVar220[0x27];
                        local_400[0x28] = (RTCHitN)auVar220[0x28];
                        local_400[0x29] = (RTCHitN)auVar220[0x29];
                        local_400[0x2a] = (RTCHitN)auVar220[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar220[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar220[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar220[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar220[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar220[0x2f];
                        local_400[0x30] = (RTCHitN)auVar220[0x30];
                        local_400[0x31] = (RTCHitN)auVar220[0x31];
                        local_400[0x32] = (RTCHitN)auVar220[0x32];
                        local_400[0x33] = (RTCHitN)auVar220[0x33];
                        local_400[0x34] = (RTCHitN)auVar220[0x34];
                        local_400[0x35] = (RTCHitN)auVar220[0x35];
                        local_400[0x36] = (RTCHitN)auVar220[0x36];
                        local_400[0x37] = (RTCHitN)auVar220[0x37];
                        local_400[0x38] = (RTCHitN)auVar220[0x38];
                        local_400[0x39] = (RTCHitN)auVar220[0x39];
                        local_400[0x3a] = (RTCHitN)auVar220[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar220[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar220[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar220[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar220[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar220[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar220 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar220);
                        vpcmpeqd_avx2(auVar220._0_32_,auVar220._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar235;
                        local_7c0 = local_4c0;
                        local_9b0.valid = (int *)local_7c0;
                        local_9b0.geometryUserPtr = pGVar3->userPtr;
                        local_9b0.context = context->user;
                        local_9b0.hit = local_400;
                        local_9b0.N = 0x10;
                        local_9b0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar233 = ZEXT464((uint)fVar238);
                          auVar255 = ZEXT1664(auVar157);
                          (*pGVar3->occlusionFilterN)(&local_9b0);
                          auVar246 = ZEXT1664(ZEXT416((uint)fVar235));
                          auVar249 = ZEXT1664(auVar75);
                          auVar223._8_4_ = 0x7fffffff;
                          auVar223._0_8_ = 0x7fffffff7fffffff;
                          auVar223._12_4_ = 0x7fffffff;
                          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar260 = ZEXT3264(auVar85);
                        }
                        auVar141 = vmovdqa64_avx512f(local_7c0);
                        uVar18 = vptestmd_avx512f(auVar141,auVar141);
                        if ((short)uVar18 == 0) {
                          bVar66 = false;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            (*p_Var7)(&local_9b0);
                            auVar246 = ZEXT1664(ZEXT416((uint)fVar235));
                            auVar249 = ZEXT1664(auVar75);
                            auVar223._8_4_ = 0x7fffffff;
                            auVar223._0_8_ = 0x7fffffff7fffffff;
                            auVar223._12_4_ = 0x7fffffff;
                            auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar260 = ZEXT3264(auVar85);
                          }
                          auVar220 = vmovdqa64_avx512f(local_7c0);
                          uVar70 = vptestmd_avx512f(auVar220,auVar220);
                          auVar220 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar69 = (bool)((byte)uVar70 & 1);
                          auVar141._0_4_ =
                               (uint)bVar69 * auVar220._0_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x200);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          auVar141._4_4_ =
                               (uint)bVar69 * auVar220._4_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x204);
                          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
                          auVar141._8_4_ =
                               (uint)bVar69 * auVar220._8_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x208);
                          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
                          auVar141._12_4_ =
                               (uint)bVar69 * auVar220._12_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x20c);
                          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
                          auVar141._16_4_ =
                               (uint)bVar69 * auVar220._16_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x210);
                          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
                          auVar141._20_4_ =
                               (uint)bVar69 * auVar220._20_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x214);
                          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
                          auVar141._24_4_ =
                               (uint)bVar69 * auVar220._24_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x218);
                          bVar69 = (bool)((byte)(uVar70 >> 7) & 1);
                          auVar141._28_4_ =
                               (uint)bVar69 * auVar220._28_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x21c);
                          bVar69 = (bool)((byte)(uVar70 >> 8) & 1);
                          auVar141._32_4_ =
                               (uint)bVar69 * auVar220._32_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x220);
                          bVar69 = (bool)((byte)(uVar70 >> 9) & 1);
                          auVar141._36_4_ =
                               (uint)bVar69 * auVar220._36_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x224);
                          bVar69 = (bool)((byte)(uVar70 >> 10) & 1);
                          auVar141._40_4_ =
                               (uint)bVar69 * auVar220._40_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x228);
                          bVar69 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          auVar141._44_4_ =
                               (uint)bVar69 * auVar220._44_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x22c);
                          bVar69 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          auVar141._48_4_ =
                               (uint)bVar69 * auVar220._48_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x230);
                          bVar69 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          auVar141._52_4_ =
                               (uint)bVar69 * auVar220._52_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x234);
                          bVar69 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          auVar141._56_4_ =
                               (uint)bVar69 * auVar220._56_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x238);
                          bVar69 = SUB81(uVar70 >> 0xf,0);
                          auVar141._60_4_ =
                               (uint)bVar69 * auVar220._60_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_9b0.ray + 0x200) = auVar141;
                          bVar66 = (short)uVar70 != 0;
                        }
                        if ((bool)bVar66 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar237;
                        }
                      }
                      bVar69 = false;
                      goto LAB_01f19962;
                    }
                  }
                  bVar69 = false;
                  bVar66 = 0;
                }
              }
LAB_01f19962:
              auVar85 = auVar141._32_32_;
              if (!bVar69) goto LAB_01f19d56;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar66 = 0;
LAB_01f19d56:
            bVar65 = bVar65 | bVar66 & 1;
            auVar53._4_4_ = fStack_73c;
            auVar53._0_4_ = local_740;
            auVar53._8_4_ = fStack_738;
            auVar53._12_4_ = fStack_734;
            auVar53._16_4_ = fStack_730;
            auVar53._20_4_ = fStack_72c;
            auVar53._24_4_ = fStack_728;
            auVar53._28_4_ = fStack_724;
            uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar29._4_4_ = uVar154;
            auVar29._0_4_ = uVar154;
            auVar29._8_4_ = uVar154;
            auVar29._12_4_ = uVar154;
            auVar29._16_4_ = uVar154;
            auVar29._20_4_ = uVar154;
            auVar29._24_4_ = uVar154;
            auVar29._28_4_ = uVar154;
            uVar18 = vcmpps_avx512vl(auVar53,auVar29,2);
            bVar63 = bVar57 & bVar63 & (byte)uVar18;
          } while (bVar63 != 0);
        }
        auVar171._0_4_ = (float)local_7e0._0_4_ + (float)local_760._0_4_;
        auVar171._4_4_ = (float)local_7e0._4_4_ + (float)local_760._4_4_;
        auVar171._8_4_ = fStack_7d8 + fStack_758;
        auVar171._12_4_ = fStack_7d4 + fStack_754;
        auVar171._16_4_ = fStack_7d0 + fStack_750;
        auVar171._20_4_ = fStack_7cc + fStack_74c;
        auVar171._24_4_ = fStack_7c8 + fStack_748;
        auVar171._28_4_ = fStack_7c4 + fStack_744;
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar30._4_4_ = uVar154;
        auVar30._0_4_ = uVar154;
        auVar30._8_4_ = uVar154;
        auVar30._12_4_ = uVar154;
        auVar30._16_4_ = uVar154;
        auVar30._20_4_ = uVar154;
        auVar30._24_4_ = uVar154;
        auVar30._28_4_ = uVar154;
        uVar18 = vcmpps_avx512vl(auVar171,auVar30,2);
        bVar64 = (byte)uVar16 | ~bVar64;
        bVar56 = (byte)uVar17 & bVar56 & (byte)uVar18;
        auVar172._8_4_ = 2;
        auVar172._0_8_ = 0x200000002;
        auVar172._12_4_ = 2;
        auVar172._16_4_ = 2;
        auVar172._20_4_ = 2;
        auVar172._24_4_ = 2;
        auVar172._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar172,auVar31);
        local_760._0_4_ = (uint)(bVar64 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar69 = (bool)(bVar64 >> 1 & 1);
        local_760._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 2 & 1);
        fStack_758 = (float)((uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 3 & 1);
        fStack_754 = (float)((uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 4 & 1);
        fStack_750 = (float)((uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 5 & 1);
        fStack_74c = (float)((uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar64 >> 6 & 1);
        fStack_748 = (float)((uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * 2);
        fStack_744 = (float)((uint)(bVar64 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2);
        auVar145._32_32_ = auVar85;
        auVar145._0_32_ = _local_760;
        uVar16 = vpcmpd_avx512vl(_local_760,local_6e0,2);
        bVar64 = (byte)uVar16 & bVar56;
        if (bVar64 != 0) {
          auVar75 = vminps_avx(local_900._0_16_,local_940._0_16_);
          auVar74 = vmaxps_avx(local_900._0_16_,local_940._0_16_);
          auVar82 = vminps_avx(local_920._0_16_,local_960._0_16_);
          auVar161 = vminps_avx(auVar75,auVar82);
          auVar75 = vmaxps_avx(local_920._0_16_,local_960._0_16_);
          auVar82 = vmaxps_avx(auVar74,auVar75);
          auVar74 = vandps_avx(auVar161,auVar223);
          auVar75 = vandps_avx(auVar82,auVar223);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar231 = auVar74._0_4_ * 1.9073486e-06;
          local_8c0 = vshufps_avx(auVar82,auVar82,0xff);
          _local_840 = _local_680;
          local_740 = (float)local_7e0._0_4_ + (float)local_680._0_4_;
          fStack_73c = (float)local_7e0._4_4_ + (float)local_680._4_4_;
          fStack_738 = fStack_7d8 + fStack_678;
          fStack_734 = fStack_7d4 + fStack_674;
          fStack_730 = fStack_7d0 + fStack_670;
          fStack_72c = fStack_7cc + fStack_66c;
          fStack_728 = fStack_7c8 + fStack_668;
          fStack_724 = fStack_7c4 + fStack_664;
          do {
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar85 = vblendmps_avx512vl(auVar173,_local_840);
            auVar135._0_4_ =
                 (uint)(bVar64 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar69 * auVar85._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar69 * auVar85._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar64 >> 6) * auVar85._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar145._0_32_ = auVar135;
            auVar85 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar85 = vminps_avx(auVar135,auVar85);
            auVar96 = vshufpd_avx(auVar85,auVar85,5);
            auVar85 = vminps_avx(auVar85,auVar96);
            auVar96 = vpermpd_avx2(auVar85,0x4e);
            auVar85 = vminps_avx(auVar85,auVar96);
            uVar16 = vcmpps_avx512vl(auVar135,auVar85,0);
            bVar66 = (byte)uVar16 & bVar64;
            bVar63 = bVar64;
            if (bVar66 != 0) {
              bVar63 = bVar66;
            }
            iVar19 = 0;
            for (uVar71 = (uint)bVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar63 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar71 = *(uint *)(local_720 + (uint)(iVar19 << 2));
            uVar146 = *(uint *)(local_660 + (uint)(iVar19 << 2));
            fVar234 = auVar72._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar234 = sqrtf((float)local_980._0_4_);
            }
            auVar249 = ZEXT464(uVar71);
            auVar246 = ZEXT464(uVar146);
            bVar66 = ~bVar63;
            lVar68 = 5;
            do {
              auVar85 = auVar145._32_32_;
              fVar235 = auVar246._0_4_;
              auVar160._4_4_ = fVar235;
              auVar160._0_4_ = fVar235;
              auVar160._8_4_ = fVar235;
              auVar160._12_4_ = fVar235;
              auVar74 = vfmadd132ps_fma(auVar160,ZEXT816(0) << 0x40,local_970);
              fVar210 = auVar249._0_4_;
              fVar239 = 1.0 - fVar210;
              auVar76 = SUB6416(ZEXT464(0x40400000),0);
              auVar73 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar248 = auVar249._0_16_;
              auVar82 = vfmadd213ss_fma(auVar76,auVar248,auVar73);
              auVar75 = vfmadd213ss_fma(auVar82,ZEXT416((uint)(fVar210 * fVar210)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar161 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar239),auVar73);
              auVar161 = vfmadd213ss_fma(auVar161,ZEXT416((uint)(fVar239 * fVar239)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar236 = fVar239 * fVar239 * -fVar210 * 0.5;
              fVar237 = auVar75._0_4_ * 0.5;
              fVar238 = auVar161._0_4_ * 0.5;
              fVar253 = fVar210 * fVar210 * -fVar239 * 0.5;
              auVar214._0_4_ = fVar253 * (float)local_960._0_4_;
              auVar214._4_4_ = fVar253 * (float)local_960._4_4_;
              auVar214._8_4_ = fVar253 * fStack_958;
              auVar214._12_4_ = fVar253 * fStack_954;
              auVar224._4_4_ = fVar238;
              auVar224._0_4_ = fVar238;
              auVar224._8_4_ = fVar238;
              auVar224._12_4_ = fVar238;
              auVar75 = vfmadd132ps_fma(auVar224,auVar214,local_920._0_16_);
              auVar202._4_4_ = fVar237;
              auVar202._0_4_ = fVar237;
              auVar202._8_4_ = fVar237;
              auVar202._12_4_ = fVar237;
              auVar75 = vfmadd132ps_fma(auVar202,auVar75,local_940._0_16_);
              auVar215._4_4_ = fVar236;
              auVar215._0_4_ = fVar236;
              auVar215._8_4_ = fVar236;
              auVar215._12_4_ = fVar236;
              auVar75 = vfmadd132ps_fma(auVar215,auVar75,local_900._0_16_);
              auVar161 = vfmadd231ss_fma(auVar73,auVar248,ZEXT416(0x41100000));
              local_820._0_16_ = auVar161;
              local_860 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar248,
                                          ZEXT416(0x40800000));
              local_870 = vfmadd213ss_fma(auVar76,auVar248,ZEXT416(0xbf800000));
              local_800._0_16_ = auVar75;
              auVar75 = vsubps_avx(auVar74,auVar75);
              auVar74 = vdpps_avx(auVar75,auVar75,0x7f);
              fVar236 = auVar74._0_4_;
              if (fVar236 < 0.0) {
                auVar255._0_4_ = sqrtf(fVar236);
                auVar255._4_60_ = extraout_var_00;
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar161 = auVar255._0_16_;
              }
              else {
                auVar161 = vsqrtss_avx(auVar74,auVar74);
              }
              auVar77 = vfnmadd231ss_fma(ZEXT416((uint)(fVar210 * (fVar239 + fVar239))),
                                         ZEXT416((uint)fVar239),ZEXT416((uint)fVar239));
              auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)(fVar210 + fVar210)),
                                        ZEXT416((uint)(fVar210 * fVar210 * 3.0)));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar248,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar239 * -3.0)),
                                        ZEXT416((uint)(fVar239 + fVar239)),auVar73);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(fVar239 * -2.0)),auVar248,
                                        ZEXT416((uint)(fVar210 * fVar210)));
              fVar237 = auVar77._0_4_ * 0.5;
              fVar238 = auVar82._0_4_ * 0.5;
              fVar253 = auVar76._0_4_ * 0.5;
              fVar239 = auVar73._0_4_ * 0.5;
              auVar216._0_4_ = fVar239 * (float)local_960._0_4_;
              auVar216._4_4_ = fVar239 * (float)local_960._4_4_;
              auVar216._8_4_ = fVar239 * fStack_958;
              auVar216._12_4_ = fVar239 * fStack_954;
              auVar203._4_4_ = fVar253;
              auVar203._0_4_ = fVar253;
              auVar203._8_4_ = fVar253;
              auVar203._12_4_ = fVar253;
              auVar82 = vfmadd132ps_fma(auVar203,auVar216,local_920._0_16_);
              auVar183._4_4_ = fVar238;
              auVar183._0_4_ = fVar238;
              auVar183._8_4_ = fVar238;
              auVar183._12_4_ = fVar238;
              auVar82 = vfmadd132ps_fma(auVar183,auVar82,local_940._0_16_);
              auVar257._4_4_ = fVar237;
              auVar257._0_4_ = fVar237;
              auVar257._8_4_ = fVar237;
              auVar257._12_4_ = fVar237;
              auVar73 = vfmadd132ps_fma(auVar257,auVar82,local_900._0_16_);
              auVar82 = vdpps_avx(auVar73,auVar73,0x7f);
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT812(0);
              fVar237 = auVar82._0_4_;
              auVar76 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar237));
              fVar238 = auVar76._0_4_;
              auVar77 = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar237));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar82,auVar22);
              auVar76 = vfnmadd213ss_fma(auVar77,auVar82,SUB6416(ZEXT464(0x40000000),0));
              uVar71 = auVar161._0_4_;
              if (fVar237 < auVar78._0_4_) {
                fVar253 = sqrtf(fVar237);
                auVar161 = ZEXT416(uVar71);
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar253 = auVar82._0_4_;
              }
              fVar238 = fVar238 * 1.5 + fVar237 * -0.5 * fVar238 * fVar238 * fVar238;
              auVar162._0_4_ = auVar73._0_4_ * fVar238;
              auVar162._4_4_ = auVar73._4_4_ * fVar238;
              auVar162._8_4_ = auVar73._8_4_ * fVar238;
              auVar162._12_4_ = auVar73._12_4_ * fVar238;
              auVar82 = vdpps_avx(auVar75,auVar162,0x7f);
              fVar240 = auVar161._0_4_;
              auVar163._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar163._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar163._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar163._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar79 = vsubps_avx512vl(auVar74,auVar163);
              fVar239 = auVar79._0_4_;
              auVar184._4_12_ = ZEXT812(0) << 0x20;
              auVar184._0_4_ = fVar239;
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              auVar80 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
              if (fVar239 < 0.0) {
                local_8a0 = fVar238;
                fStack_89c = fVar238;
                fStack_898 = fVar238;
                fStack_894 = fVar238;
                local_890 = auVar78;
                local_880 = auVar82;
                fVar155 = sqrtf(fVar239);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar161 = ZEXT416(uVar71);
                auVar82 = local_880;
                auVar78 = local_890;
                fVar238 = local_8a0;
                fVar244 = fStack_89c;
                fVar245 = fStack_898;
                fVar247 = fStack_894;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar155 = auVar79._0_4_;
                fVar244 = fVar238;
                fVar245 = fVar238;
                fVar247 = fVar238;
              }
              auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar260 = ZEXT3264(auVar96);
              auVar142._32_32_ = auVar85;
              auVar142._0_32_ = auVar175._0_32_;
              auVar185._0_4_ = (float)local_870._0_4_ * (float)local_960._0_4_;
              auVar185._4_4_ = (float)local_870._0_4_ * (float)local_960._4_4_;
              auVar185._8_4_ = (float)local_870._0_4_ * fStack_958;
              auVar185._12_4_ = (float)local_870._0_4_ * fStack_954;
              auVar204._4_4_ = local_860._0_4_;
              auVar204._0_4_ = local_860._0_4_;
              auVar204._8_4_ = local_860._0_4_;
              auVar204._12_4_ = local_860._0_4_;
              auVar79 = vfmadd132ps_fma(auVar204,auVar185,local_920._0_16_);
              auVar186._4_4_ = local_820._0_4_;
              auVar186._0_4_ = local_820._0_4_;
              auVar186._8_4_ = local_820._0_4_;
              auVar186._12_4_ = local_820._0_4_;
              auVar79 = vfmadd132ps_fma(auVar186,auVar79,local_940._0_16_);
              auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar248,ZEXT416(0x40000000)
                                        );
              auVar205._0_4_ = auVar248._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar248 = vfmadd132ps_fma(auVar205,auVar79,local_900._0_16_);
              auVar187._0_4_ = auVar248._0_4_ * fVar237;
              auVar187._4_4_ = auVar248._4_4_ * fVar237;
              auVar187._8_4_ = auVar248._8_4_ * fVar237;
              auVar187._12_4_ = auVar248._12_4_ * fVar237;
              auVar248 = vdpps_avx(auVar73,auVar248,0x7f);
              fVar237 = auVar248._0_4_;
              auVar206._0_4_ = auVar73._0_4_ * fVar237;
              auVar206._4_4_ = auVar73._4_4_ * fVar237;
              auVar206._8_4_ = auVar73._8_4_ * fVar237;
              auVar206._12_4_ = auVar73._12_4_ * fVar237;
              auVar248 = vsubps_avx(auVar187,auVar206);
              local_be0 = auVar77._0_4_;
              local_be0 = auVar76._0_4_ * local_be0;
              auVar77 = vmaxss_avx(ZEXT416((uint)fVar231),
                                   ZEXT416((uint)(fVar235 * fVar234 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar145._16_48_ = auVar142._16_48_;
              auVar81 = vxorps_avx512vl(auVar73,auVar23);
              auVar207._0_4_ = fVar238 * auVar248._0_4_ * local_be0;
              auVar207._4_4_ = fVar244 * auVar248._4_4_ * local_be0;
              auVar207._8_4_ = fVar245 * auVar248._8_4_ * local_be0;
              auVar207._12_4_ = fVar247 * auVar248._12_4_ * local_be0;
              auVar255 = ZEXT1664(auVar162);
              auVar76 = vdpps_avx(auVar81,auVar162,0x7f);
              auVar248 = vfmadd213ss_fma(auVar161,ZEXT416((uint)fVar231),auVar77);
              auVar161 = vdpps_avx(auVar75,auVar207,0x7f);
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 + 1.0)),
                                        ZEXT416((uint)(fVar231 / fVar253)),auVar248);
              fVar237 = auVar76._0_4_ + auVar161._0_4_;
              auVar161 = vdpps_avx(local_970,auVar162,0x7f);
              auVar76 = vdpps_avx(auVar75,auVar81,0x7f);
              fVar238 = auVar78._0_4_;
              auVar145._0_16_ =
                   vaddss_avx512f(auVar80,ZEXT416((uint)(fVar238 * fVar239 * -0.5 *
                                                        fVar238 * fVar238)));
              auVar248 = vdpps_avx(auVar75,local_970,0x7f);
              auVar78 = vfnmadd231ss_fma(auVar76,auVar82,ZEXT416((uint)fVar237));
              auVar80 = vfnmadd231ss_fma(auVar248,auVar82,auVar161);
              auVar76 = vpermilps_avx(local_800._0_16_,0xff);
              fVar155 = fVar155 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar73,auVar73,0xff);
              auVar248 = vfmsub213ss_fma(auVar78,auVar145._0_16_,auVar76);
              fVar238 = auVar80._0_4_ * auVar145._0_4_;
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar161._0_4_ * auVar248._0_4_)),
                                        ZEXT416((uint)fVar237),ZEXT416((uint)fVar238));
              fVar253 = auVar78._0_4_;
              fVar238 = auVar82._0_4_ * (fVar238 / fVar253);
              auVar233 = ZEXT464((uint)fVar238);
              fVar210 = fVar210 - (fVar238 - fVar155 * (auVar161._0_4_ / fVar253));
              auVar249 = ZEXT464((uint)fVar210);
              fVar235 = fVar235 - (fVar155 * (fVar237 / fVar253) -
                                  auVar82._0_4_ * (auVar248._0_4_ / fVar253));
              auVar246 = ZEXT464((uint)fVar235);
              auVar225._8_4_ = 0x7fffffff;
              auVar225._0_8_ = 0x7fffffff7fffffff;
              auVar225._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar82,auVar225);
              bVar69 = true;
              if (auVar82._0_4_ < auVar79._0_4_) {
                auVar161 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ + auVar77._0_4_)),local_8c0,
                                           ZEXT416(0x36000000));
                auVar82 = vandps_avx(ZEXT416((uint)fVar155),auVar225);
                if (auVar82._0_4_ < auVar161._0_4_) {
                  fVar235 = fVar235 + (float)local_8b0._0_4_;
                  auVar246 = ZEXT464((uint)fVar235);
                  if ((((fVar153 <= fVar235) &&
                       (fVar237 = *(float *)(ray + k * 4 + 0x200), fVar235 <= fVar237)) &&
                      (0.0 <= fVar210)) && (fVar210 <= 1.0)) {
                    auVar144._16_48_ = auVar145._16_48_;
                    auVar144._0_16_ = ZEXT816(0) << 0x20;
                    auVar143._4_60_ = auVar144._4_60_;
                    auVar143._0_4_ = fVar236;
                    auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar143._0_16_);
                    fVar236 = auVar82._0_4_;
                    auVar145._0_16_ = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar63 = true;
                      }
                      else {
                        fVar236 = fVar236 * 1.5 + auVar145._0_4_ * fVar236 * fVar236 * fVar236;
                        auVar188._0_4_ = auVar75._0_4_ * fVar236;
                        auVar188._4_4_ = auVar75._4_4_ * fVar236;
                        auVar188._8_4_ = auVar75._8_4_ * fVar236;
                        auVar188._12_4_ = auVar75._12_4_ * fVar236;
                        auVar161 = vfmadd213ps_fma(auVar76,auVar188,auVar73);
                        auVar74 = vshufps_avx(auVar188,auVar188,0xc9);
                        auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar189._0_4_ = auVar188._0_4_ * auVar75._0_4_;
                        auVar189._4_4_ = auVar188._4_4_ * auVar75._4_4_;
                        auVar189._8_4_ = auVar188._8_4_ * auVar75._8_4_;
                        auVar189._12_4_ = auVar188._12_4_ * auVar75._12_4_;
                        auVar82 = vfmsub231ps_fma(auVar189,auVar73,auVar74);
                        auVar74 = vshufps_avx(auVar82,auVar82,0xc9);
                        auVar75 = vshufps_avx(auVar161,auVar161,0xc9);
                        auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                        auVar164._0_4_ = auVar161._0_4_ * auVar82._0_4_;
                        auVar164._4_4_ = auVar161._4_4_ * auVar82._4_4_;
                        auVar164._8_4_ = auVar161._8_4_ * auVar82._8_4_;
                        auVar164._12_4_ = auVar161._12_4_ * auVar82._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar164,auVar74,auVar75);
                        auVar75 = ZEXT416((uint)fVar210);
                        local_340 = vbroadcastss_avx512f(auVar75);
                        auVar220 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar220 = vpermps_avx512f(auVar220,ZEXT1664(auVar74));
                        auVar145 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar145,ZEXT1664(auVar74));
                        local_380 = vbroadcastss_avx512f(auVar74);
                        local_400[0] = (RTCHitN)auVar220[0];
                        local_400[1] = (RTCHitN)auVar220[1];
                        local_400[2] = (RTCHitN)auVar220[2];
                        local_400[3] = (RTCHitN)auVar220[3];
                        local_400[4] = (RTCHitN)auVar220[4];
                        local_400[5] = (RTCHitN)auVar220[5];
                        local_400[6] = (RTCHitN)auVar220[6];
                        local_400[7] = (RTCHitN)auVar220[7];
                        local_400[8] = (RTCHitN)auVar220[8];
                        local_400[9] = (RTCHitN)auVar220[9];
                        local_400[10] = (RTCHitN)auVar220[10];
                        local_400[0xb] = (RTCHitN)auVar220[0xb];
                        local_400[0xc] = (RTCHitN)auVar220[0xc];
                        local_400[0xd] = (RTCHitN)auVar220[0xd];
                        local_400[0xe] = (RTCHitN)auVar220[0xe];
                        local_400[0xf] = (RTCHitN)auVar220[0xf];
                        local_400[0x10] = (RTCHitN)auVar220[0x10];
                        local_400[0x11] = (RTCHitN)auVar220[0x11];
                        local_400[0x12] = (RTCHitN)auVar220[0x12];
                        local_400[0x13] = (RTCHitN)auVar220[0x13];
                        local_400[0x14] = (RTCHitN)auVar220[0x14];
                        local_400[0x15] = (RTCHitN)auVar220[0x15];
                        local_400[0x16] = (RTCHitN)auVar220[0x16];
                        local_400[0x17] = (RTCHitN)auVar220[0x17];
                        local_400[0x18] = (RTCHitN)auVar220[0x18];
                        local_400[0x19] = (RTCHitN)auVar220[0x19];
                        local_400[0x1a] = (RTCHitN)auVar220[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar220[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar220[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar220[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar220[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar220[0x1f];
                        local_400[0x20] = (RTCHitN)auVar220[0x20];
                        local_400[0x21] = (RTCHitN)auVar220[0x21];
                        local_400[0x22] = (RTCHitN)auVar220[0x22];
                        local_400[0x23] = (RTCHitN)auVar220[0x23];
                        local_400[0x24] = (RTCHitN)auVar220[0x24];
                        local_400[0x25] = (RTCHitN)auVar220[0x25];
                        local_400[0x26] = (RTCHitN)auVar220[0x26];
                        local_400[0x27] = (RTCHitN)auVar220[0x27];
                        local_400[0x28] = (RTCHitN)auVar220[0x28];
                        local_400[0x29] = (RTCHitN)auVar220[0x29];
                        local_400[0x2a] = (RTCHitN)auVar220[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar220[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar220[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar220[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar220[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar220[0x2f];
                        local_400[0x30] = (RTCHitN)auVar220[0x30];
                        local_400[0x31] = (RTCHitN)auVar220[0x31];
                        local_400[0x32] = (RTCHitN)auVar220[0x32];
                        local_400[0x33] = (RTCHitN)auVar220[0x33];
                        local_400[0x34] = (RTCHitN)auVar220[0x34];
                        local_400[0x35] = (RTCHitN)auVar220[0x35];
                        local_400[0x36] = (RTCHitN)auVar220[0x36];
                        local_400[0x37] = (RTCHitN)auVar220[0x37];
                        local_400[0x38] = (RTCHitN)auVar220[0x38];
                        local_400[0x39] = (RTCHitN)auVar220[0x39];
                        local_400[0x3a] = (RTCHitN)auVar220[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar220[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar220[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar220[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar220[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar220[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar220 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar220);
                        vpcmpeqd_avx2(auVar220._0_32_,auVar220._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar235;
                        local_7c0 = local_4c0;
                        local_9b0.valid = (int *)local_7c0;
                        local_9b0.geometryUserPtr = pGVar3->userPtr;
                        local_9b0.context = context->user;
                        local_9b0.hit = local_400;
                        local_9b0.N = 0x10;
                        local_9b0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar233 = ZEXT464((uint)fVar238);
                          auVar255 = ZEXT1664(auVar162);
                          (*pGVar3->occlusionFilterN)(&local_9b0);
                          auVar246 = ZEXT1664(ZEXT416((uint)fVar235));
                          auVar249 = ZEXT1664(auVar75);
                          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar260 = ZEXT3264(auVar85);
                        }
                        auVar145 = vmovdqa64_avx512f(local_7c0);
                        uVar16 = vptestmd_avx512f(auVar145,auVar145);
                        if ((short)uVar16 == 0) {
                          bVar63 = false;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            (*p_Var7)(&local_9b0);
                            auVar246 = ZEXT1664(ZEXT416((uint)fVar235));
                            auVar249 = ZEXT1664(auVar75);
                            auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar260 = ZEXT3264(auVar85);
                          }
                          auVar220 = vmovdqa64_avx512f(local_7c0);
                          uVar70 = vptestmd_avx512f(auVar220,auVar220);
                          auVar220 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar69 = (bool)((byte)uVar70 & 1);
                          auVar145._0_4_ =
                               (uint)bVar69 * auVar220._0_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x200);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          auVar145._4_4_ =
                               (uint)bVar69 * auVar220._4_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x204);
                          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
                          auVar145._8_4_ =
                               (uint)bVar69 * auVar220._8_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x208);
                          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
                          auVar145._12_4_ =
                               (uint)bVar69 * auVar220._12_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x20c);
                          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
                          auVar145._16_4_ =
                               (uint)bVar69 * auVar220._16_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x210);
                          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
                          auVar145._20_4_ =
                               (uint)bVar69 * auVar220._20_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x214);
                          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
                          auVar145._24_4_ =
                               (uint)bVar69 * auVar220._24_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x218);
                          bVar69 = (bool)((byte)(uVar70 >> 7) & 1);
                          auVar145._28_4_ =
                               (uint)bVar69 * auVar220._28_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x21c);
                          bVar69 = (bool)((byte)(uVar70 >> 8) & 1);
                          auVar145._32_4_ =
                               (uint)bVar69 * auVar220._32_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x220);
                          bVar69 = (bool)((byte)(uVar70 >> 9) & 1);
                          auVar145._36_4_ =
                               (uint)bVar69 * auVar220._36_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x224);
                          bVar69 = (bool)((byte)(uVar70 >> 10) & 1);
                          auVar145._40_4_ =
                               (uint)bVar69 * auVar220._40_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x228);
                          bVar69 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          auVar145._44_4_ =
                               (uint)bVar69 * auVar220._44_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x22c);
                          bVar69 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          auVar145._48_4_ =
                               (uint)bVar69 * auVar220._48_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x230);
                          bVar69 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          auVar145._52_4_ =
                               (uint)bVar69 * auVar220._52_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x234);
                          bVar69 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          auVar145._56_4_ =
                               (uint)bVar69 * auVar220._56_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x238);
                          bVar69 = SUB81(uVar70 >> 0xf,0);
                          auVar145._60_4_ =
                               (uint)bVar69 * auVar220._60_4_ |
                               (uint)!bVar69 * *(int *)(local_9b0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_9b0.ray + 0x200) = auVar145;
                          bVar63 = (short)uVar70 != 0;
                        }
                        if ((bool)bVar63 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar237;
                        }
                      }
                      bVar69 = false;
                      goto LAB_01f1a5dc;
                    }
                  }
                  bVar69 = false;
                  bVar63 = 0;
                }
              }
LAB_01f1a5dc:
              if (!bVar69) goto LAB_01f1a9be;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar63 = 0;
LAB_01f1a9be:
            bVar65 = bVar65 | bVar63 & 1;
            auVar54._4_4_ = fStack_73c;
            auVar54._0_4_ = local_740;
            auVar54._8_4_ = fStack_738;
            auVar54._12_4_ = fStack_734;
            auVar54._16_4_ = fStack_730;
            auVar54._20_4_ = fStack_72c;
            auVar54._24_4_ = fStack_728;
            auVar54._28_4_ = fStack_724;
            uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar32._4_4_ = uVar154;
            auVar32._0_4_ = uVar154;
            auVar32._8_4_ = uVar154;
            auVar32._12_4_ = uVar154;
            auVar32._16_4_ = uVar154;
            auVar32._20_4_ = uVar154;
            auVar32._24_4_ = uVar154;
            auVar32._28_4_ = uVar154;
            uVar16 = vcmpps_avx512vl(auVar54,auVar32,2);
            bVar64 = bVar66 & bVar64 & (byte)uVar16;
          } while (bVar64 != 0);
        }
        uVar18 = vpcmpd_avx512vl(local_6e0,_local_760,1);
        uVar17 = vpcmpd_avx512vl(local_6e0,local_640,1);
        auVar191._0_4_ = (float)local_7e0._0_4_ + (float)local_500._0_4_;
        auVar191._4_4_ = (float)local_7e0._4_4_ + (float)local_500._4_4_;
        auVar191._8_4_ = fStack_7d8 + fStack_4f8;
        auVar191._12_4_ = fStack_7d4 + fStack_4f4;
        auVar191._16_4_ = fStack_7d0 + fStack_4f0;
        auVar191._20_4_ = fStack_7cc + fStack_4ec;
        auVar191._24_4_ = fStack_7c8 + fStack_4e8;
        auVar191._28_4_ = fStack_7c4 + fStack_4e4;
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar209._4_4_ = uVar154;
        auVar209._0_4_ = uVar154;
        auVar209._8_4_ = uVar154;
        auVar209._12_4_ = uVar154;
        auVar209._16_4_ = uVar154;
        auVar209._20_4_ = uVar154;
        auVar209._24_4_ = uVar154;
        auVar209._28_4_ = uVar154;
        uVar16 = vcmpps_avx512vl(auVar191,auVar209,2);
        bVar58 = bVar58 & (byte)uVar17 & (byte)uVar16;
        auVar219._0_4_ = (float)local_7e0._0_4_ + local_680._0_4_;
        auVar219._4_4_ = (float)local_7e0._4_4_ + local_680._4_4_;
        auVar219._8_4_ = fStack_7d8 + local_680._8_4_;
        auVar219._12_4_ = fStack_7d4 + local_680._12_4_;
        auVar219._16_4_ = fStack_7d0 + local_680._16_4_;
        auVar219._20_4_ = fStack_7cc + local_680._20_4_;
        auVar219._24_4_ = fStack_7c8 + local_680._24_4_;
        auVar219._28_4_ = fStack_7c4 + local_680._28_4_;
        uVar16 = vcmpps_avx512vl(auVar219,auVar209,2);
        bVar56 = bVar56 & (byte)uVar18 & (byte)uVar16 | bVar58;
        if (bVar56 != 0) {
          abStack_1a0[uVar59 * 0x60] = bVar56;
          auVar136._0_4_ =
               (uint)(bVar58 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar58 & 1) * (int)local_680._0_4_;
          bVar69 = (bool)(bVar58 >> 1 & 1);
          auVar136._4_4_ = (uint)bVar69 * local_500._4_4_ | (uint)!bVar69 * (int)local_680._4_4_;
          bVar69 = (bool)(bVar58 >> 2 & 1);
          auVar136._8_4_ = (uint)bVar69 * (int)fStack_4f8 | (uint)!bVar69 * (int)local_680._8_4_;
          bVar69 = (bool)(bVar58 >> 3 & 1);
          auVar136._12_4_ = (uint)bVar69 * (int)fStack_4f4 | (uint)!bVar69 * (int)local_680._12_4_;
          bVar69 = (bool)(bVar58 >> 4 & 1);
          auVar136._16_4_ = (uint)bVar69 * (int)fStack_4f0 | (uint)!bVar69 * (int)local_680._16_4_;
          bVar69 = (bool)(bVar58 >> 5 & 1);
          auVar136._20_4_ = (uint)bVar69 * (int)fStack_4ec | (uint)!bVar69 * (int)local_680._20_4_;
          auVar136._24_4_ =
               (uint)(bVar58 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar58 >> 6) * (int)local_680._24_4_;
          auVar136._28_4_ = local_680._28_4_;
          auVar145._0_32_ = auVar136;
          *(undefined1 (*) [32])(auStack_180 + uVar59 * 0x60) = auVar136;
          uVar16 = vmovlps_avx(local_8d0);
          *(undefined8 *)(afStack_160 + uVar59 * 0x18) = uVar16;
          aiStack_158[uVar59 * 0x18] = iVar67 + 1;
          uVar59 = (ulong)((int)uVar59 + 1);
          goto LAB_01f1aab8;
        }
        auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if ((int)uVar59 == 0) {
        if (bVar65 != 0) {
          return local_cb9;
        }
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar154;
        auVar34._0_4_ = uVar154;
        auVar34._8_4_ = uVar154;
        auVar34._12_4_ = uVar154;
        auVar34._16_4_ = uVar154;
        auVar34._20_4_ = uVar154;
        auVar34._24_4_ = uVar154;
        auVar34._28_4_ = uVar154;
        uVar16 = vcmpps_avx512vl(local_620,auVar34,2);
        uVar60 = (uint)uVar16 & (uint)local_848 - 1 & (uint)local_848;
        local_848 = (ulong)uVar60;
        local_cb9 = uVar60 != 0;
        if (!local_cb9) {
          return local_cb9;
        }
        goto LAB_01f181af;
      }
      uVar62 = (ulong)((int)uVar59 - 1);
      lVar68 = uVar62 * 0x60;
      auVar85 = *(undefined1 (*) [32])(auStack_180 + lVar68);
      auVar192._0_4_ = auVar85._0_4_ + (float)local_7e0._0_4_;
      auVar192._4_4_ = auVar85._4_4_ + (float)local_7e0._4_4_;
      auVar192._8_4_ = auVar85._8_4_ + fStack_7d8;
      auVar192._12_4_ = auVar85._12_4_ + fStack_7d4;
      auVar192._16_4_ = auVar85._16_4_ + fStack_7d0;
      auVar192._20_4_ = auVar85._20_4_ + fStack_7cc;
      auVar192._24_4_ = auVar85._24_4_ + fStack_7c8;
      auVar192._28_4_ = auVar85._28_4_ + fStack_7c4;
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar33._4_4_ = uVar154;
      auVar33._0_4_ = uVar154;
      auVar33._8_4_ = uVar154;
      auVar33._12_4_ = uVar154;
      auVar33._16_4_ = uVar154;
      auVar33._20_4_ = uVar154;
      auVar33._24_4_ = uVar154;
      auVar33._28_4_ = uVar154;
      uVar16 = vcmpps_avx512vl(auVar192,auVar33,2);
      uVar71 = (uint)uVar16 & (uint)abStack_1a0[lVar68];
      bVar56 = (byte)uVar71;
      uVar70 = uVar62;
      if (uVar71 != 0) {
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar193,auVar85);
        auVar137._0_4_ =
             (uint)(bVar56 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar85._0_4_;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * (int)auVar85._4_4_;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * (int)auVar85._8_4_;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * (int)auVar85._12_4_;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * (int)auVar85._16_4_;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * (int)auVar85._20_4_;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * (int)auVar85._24_4_;
        auVar137._28_4_ =
             (uVar71 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar71 >> 7,0) * (int)auVar85._28_4_;
        auVar145._0_32_ = auVar137;
        auVar85 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar85 = vminps_avx(auVar137,auVar85);
        auVar96 = vshufpd_avx(auVar85,auVar85,5);
        auVar85 = vminps_avx(auVar85,auVar96);
        auVar96 = vpermpd_avx2(auVar85,0x4e);
        auVar85 = vminps_avx(auVar85,auVar96);
        uVar16 = vcmpps_avx512vl(auVar137,auVar85,0);
        bVar64 = (byte)uVar16 & bVar56;
        if (bVar64 != 0) {
          uVar71 = (uint)bVar64;
        }
        fVar231 = afStack_160[uVar62 * 0x18 + 1];
        uVar146 = 0;
        for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
          uVar146 = uVar146 + 1;
        }
        iVar67 = aiStack_158[uVar62 * 0x18];
        bVar64 = ~('\x01' << ((byte)uVar146 & 0x1f)) & bVar56;
        abStack_1a0[lVar68] = bVar64;
        if (bVar64 != 0) {
          uVar70 = uVar59;
        }
        fVar234 = afStack_160[uVar62 * 0x18];
        auVar194._4_4_ = fVar234;
        auVar194._0_4_ = fVar234;
        auVar194._8_4_ = fVar234;
        auVar194._12_4_ = fVar234;
        auVar194._16_4_ = fVar234;
        auVar194._20_4_ = fVar234;
        auVar194._24_4_ = fVar234;
        auVar194._28_4_ = fVar234;
        fVar231 = fVar231 - fVar234;
        auVar174._4_4_ = fVar231;
        auVar174._0_4_ = fVar231;
        auVar174._8_4_ = fVar231;
        auVar174._12_4_ = fVar231;
        auVar174._16_4_ = fVar231;
        auVar174._20_4_ = fVar231;
        auVar174._24_4_ = fVar231;
        auVar174._28_4_ = fVar231;
        auVar74 = vfmadd132ps_fma(auVar174,auVar194,_DAT_02020f20);
        auVar85 = ZEXT1632(auVar74);
        local_400[0] = (RTCHitN)auVar85[0];
        local_400[1] = (RTCHitN)auVar85[1];
        local_400[2] = (RTCHitN)auVar85[2];
        local_400[3] = (RTCHitN)auVar85[3];
        local_400[4] = (RTCHitN)auVar85[4];
        local_400[5] = (RTCHitN)auVar85[5];
        local_400[6] = (RTCHitN)auVar85[6];
        local_400[7] = (RTCHitN)auVar85[7];
        local_400[8] = (RTCHitN)auVar85[8];
        local_400[9] = (RTCHitN)auVar85[9];
        local_400[10] = (RTCHitN)auVar85[10];
        local_400[0xb] = (RTCHitN)auVar85[0xb];
        local_400[0xc] = (RTCHitN)auVar85[0xc];
        local_400[0xd] = (RTCHitN)auVar85[0xd];
        local_400[0xe] = (RTCHitN)auVar85[0xe];
        local_400[0xf] = (RTCHitN)auVar85[0xf];
        local_400[0x10] = (RTCHitN)auVar85[0x10];
        local_400[0x11] = (RTCHitN)auVar85[0x11];
        local_400[0x12] = (RTCHitN)auVar85[0x12];
        local_400[0x13] = (RTCHitN)auVar85[0x13];
        local_400[0x14] = (RTCHitN)auVar85[0x14];
        local_400[0x15] = (RTCHitN)auVar85[0x15];
        local_400[0x16] = (RTCHitN)auVar85[0x16];
        local_400[0x17] = (RTCHitN)auVar85[0x17];
        local_400[0x18] = (RTCHitN)auVar85[0x18];
        local_400[0x19] = (RTCHitN)auVar85[0x19];
        local_400[0x1a] = (RTCHitN)auVar85[0x1a];
        local_400[0x1b] = (RTCHitN)auVar85[0x1b];
        local_400[0x1c] = (RTCHitN)auVar85[0x1c];
        local_400[0x1d] = (RTCHitN)auVar85[0x1d];
        local_400[0x1e] = (RTCHitN)auVar85[0x1e];
        local_400[0x1f] = (RTCHitN)auVar85[0x1f];
        local_8d0._8_8_ = 0;
        local_8d0._0_8_ = *(ulong *)(local_400 + (ulong)uVar146 * 4);
      }
      uVar59 = uVar70;
    } while (bVar56 == 0);
    auVar85 = auVar145._32_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }